

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  BBox1f BVar2;
  int iVar3;
  float fVar4;
  ulong uVar5;
  Geometry *pGVar6;
  long lVar7;
  RTCRayQueryContext *pRVar8;
  RTCFilterFunctionN p_Var9;
  uint uVar10;
  size_t k;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  int iVar71;
  uint uVar72;
  AABBNodeMB4D *node1;
  ulong uVar73;
  ulong uVar74;
  long lVar75;
  undefined1 (*pauVar76) [32];
  Geometry *pGVar77;
  ulong uVar78;
  Geometry *pGVar79;
  ulong *puVar80;
  NodeRef root;
  undefined4 uVar81;
  Geometry *unaff_R15;
  vuint<4> *v;
  bool bVar82;
  float fVar83;
  float fVar84;
  float fVar98;
  undefined1 auVar85 [16];
  float fVar102;
  undefined1 auVar86 [32];
  float fVar100;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar99;
  float fVar101;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 in_ZMM1 [64];
  undefined1 auVar116 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar137;
  undefined1 auVar123 [16];
  float fVar121;
  float fVar134;
  float fVar135;
  undefined1 auVar122 [16];
  undefined1 auVar124 [32];
  RTCHitN aRVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar136;
  float fVar138;
  float fVar140;
  float fVar142;
  float fVar144;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar139;
  float fVar141;
  float fVar143;
  undefined1 auVar133 [64];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar158 [64];
  undefined1 auVar161 [16];
  float fVar159;
  float fVar160;
  float fVar170;
  float fVar172;
  float fVar173;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar171;
  float fVar174;
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar189 [64];
  undefined1 auVar210 [16];
  float fVar209;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar225;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar233 [64];
  float fVar240;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar248 [64];
  undefined1 auVar255 [28];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  undefined1 auVar260 [28];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 in_ZMM11 [64];
  undefined1 auVar271 [36];
  float fVar272;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 in_ZMM12 [64];
  undefined1 auVar281 [28];
  undefined1 in_ZMM13 [64];
  undefined1 auVar282 [28];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM15 [64];
  Precalculations pre;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  vbool<8> terminated;
  QuadMesh *mesh;
  Vec3<embree::vfloat_impl<8>_> p0;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2dd9;
  ulong local_2dd8;
  ulong local_2dd0;
  ulong local_2dc8;
  undefined1 local_2dc0 [8];
  float fStack_2db8;
  float fStack_2db4;
  float fStack_2db0;
  float fStack_2dac;
  float fStack_2da8;
  float fStack_2da4;
  RayK<8> *local_2d88;
  undefined1 local_2d80 [32];
  undefined1 local_2d60 [32];
  undefined1 local_2d40 [8];
  float fStack_2d38;
  float fStack_2d34;
  float fStack_2d30;
  float fStack_2d2c;
  float fStack_2d28;
  float fStack_2d24;
  undefined1 local_2d20 [32];
  undefined1 local_2d00 [32];
  undefined1 local_2ce0 [32];
  undefined8 local_2cc0;
  float fStack_2cb8;
  float fStack_2cb4;
  float fStack_2cb0;
  float fStack_2cac;
  float fStack_2ca8;
  float local_2ca0 [4];
  float fStack_2c90;
  float fStack_2c8c;
  float fStack_2c88;
  undefined1 local_2c80 [32];
  undefined1 local_2c60 [8];
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  float fStack_2c44;
  undefined1 (*local_2c28) [32];
  undefined1 local_2c20 [8];
  float fStack_2c18;
  float fStack_2c14;
  float fStack_2c10;
  float fStack_2c0c;
  float fStack_2c08;
  float fStack_2c04;
  BVH *local_2bf0;
  Intersectors *local_2be8;
  ulong local_2be0;
  ulong local_2bd8;
  ulong local_2bd0;
  ulong local_2bc8;
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [8];
  float fStack_2b98;
  float fStack_2b94;
  float fStack_2b90;
  float fStack_2b8c;
  float fStack_2b88;
  undefined1 uStack_2b84;
  undefined1 uStack_2b83;
  undefined1 uStack_2b82;
  undefined1 uStack_2b81;
  undefined1 local_2b80 [8];
  float fStack_2b78;
  float fStack_2b74;
  float fStack_2b70;
  float fStack_2b6c;
  float fStack_2b68;
  float fStack_2b64;
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [32];
  RTCHitN local_2b20 [32];
  undefined1 local_2b00 [8];
  float fStack_2af8;
  float fStack_2af4;
  float fStack_2af0;
  float fStack_2aec;
  float fStack_2ae8;
  undefined1 local_2ae0 [8];
  float fStack_2ad8;
  float fStack_2ad4;
  float fStack_2ad0;
  float fStack_2acc;
  float fStack_2ac8;
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  uint local_2a40;
  uint uStack_2a3c;
  uint uStack_2a38;
  uint uStack_2a34;
  uint uStack_2a30;
  uint uStack_2a2c;
  uint uStack_2a28;
  uint uStack_2a24;
  uint local_2a20;
  uint uStack_2a1c;
  uint uStack_2a18;
  uint uStack_2a14;
  uint uStack_2a10;
  uint uStack_2a0c;
  uint uStack_2a08;
  uint uStack_2a04;
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [8];
  float fStack_29d8;
  float fStack_29d4;
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [8];
  float fStack_2958;
  float fStack_2954;
  float fStack_2950;
  float fStack_294c;
  float fStack_2948;
  float fStack_2944;
  undefined1 local_2940 [8];
  float fStack_2938;
  float fStack_2934;
  float fStack_2930;
  float fStack_292c;
  float fStack_2928;
  float fStack_2924;
  undefined1 local_2920 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2900;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [8];
  float fStack_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  float fStack_27e8;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar91 [32];
  undefined1 auVar95 [32];
  undefined1 auVar218 [64];
  
  local_2608 = (((BVH *)This->ptr)->root).ptr;
  if (local_2608 != 8) {
    auVar146 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar122 = ZEXT816(0) << 0x40;
    auVar110 = vpcmpeqd_avx2(auVar146,(undefined1  [32])valid_i->field_0);
    auVar146 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar122),5);
    auVar124 = auVar110 & auVar146;
    if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar124 >> 0x7f,0) != '\0') ||
          (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar124 >> 0xbf,0) != '\0') ||
        (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar124[0x1f] < '\0') {
      auVar146 = vandps_avx(auVar146,auVar110);
      auVar85 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
      local_2900._0_8_ = *(undefined8 *)ray;
      local_2900._8_8_ = *(undefined8 *)(ray + 8);
      local_2900._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2900._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2900._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2900._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2900._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2900._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2900._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2900._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2900._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2900._88_8_ = *(undefined8 *)(ray + 0x58);
      local_28a0 = *(undefined1 (*) [32])(ray + 0x80);
      local_2880 = *(undefined1 (*) [32])(ray + 0xa0);
      local_2860 = *(undefined1 (*) [32])(ray + 0xc0);
      local_2920._8_4_ = 0x7fffffff;
      local_2920._0_8_ = 0x7fffffff7fffffff;
      local_2920._12_4_ = 0x7fffffff;
      local_2920._16_4_ = 0x7fffffff;
      local_2920._20_4_ = 0x7fffffff;
      local_2920._24_4_ = 0x7fffffff;
      local_2920._28_4_ = 0x7fffffff;
      auVar153._8_4_ = 0x219392ef;
      auVar153._0_8_ = 0x219392ef219392ef;
      auVar153._12_4_ = 0x219392ef;
      auVar153._16_4_ = 0x219392ef;
      auVar153._20_4_ = 0x219392ef;
      auVar153._24_4_ = 0x219392ef;
      auVar153._28_4_ = 0x219392ef;
      auVar261._8_4_ = 0x3f800000;
      auVar261._0_8_ = 0x3f8000003f800000;
      auVar261._12_4_ = 0x3f800000;
      auVar261._16_4_ = 0x3f800000;
      auVar261._20_4_ = 0x3f800000;
      auVar261._24_4_ = 0x3f800000;
      auVar261._28_4_ = 0x3f800000;
      auVar92 = vdivps_avx(auVar261,local_28a0);
      auVar146 = vandps_avx(local_2920,local_28a0);
      auVar124 = vcmpps_avx(auVar146,auVar153,1);
      auVar146 = vandps_avx(local_2920,local_2880);
      auVar110 = vcmpps_avx(auVar146,auVar153,1);
      auVar233 = ZEXT3264(auVar110);
      auVar145 = vdivps_avx(auVar261,local_2880);
      auVar146 = vandps_avx(local_2920,local_2860);
      auVar146 = vcmpps_avx(auVar146,auVar153,1);
      auVar248 = ZEXT3264(auVar146);
      auVar162 = vdivps_avx(auVar261,local_2860);
      auVar95._8_4_ = 0x5d5e0b6b;
      auVar95._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar95._12_4_ = 0x5d5e0b6b;
      auVar95._16_4_ = 0x5d5e0b6b;
      auVar95._20_4_ = 0x5d5e0b6b;
      auVar95._24_4_ = 0x5d5e0b6b;
      auVar95._28_4_ = 0x5d5e0b6b;
      auVar259 = ZEXT3264(auVar95);
      local_2840 = vblendvps_avx(auVar92,auVar95,auVar124);
      local_2820 = vblendvps_avx(auVar145,auVar95,auVar110);
      _local_2800 = vblendvps_avx(auVar162,auVar95,auVar146);
      auVar146 = vcmpps_avx(local_2840,ZEXT1632(auVar122),1);
      auVar124._8_4_ = 0x10;
      auVar124._0_8_ = 0x1000000010;
      auVar124._12_4_ = 0x10;
      auVar124._16_4_ = 0x10;
      auVar124._20_4_ = 0x10;
      auVar124._24_4_ = 0x10;
      auVar124._28_4_ = 0x10;
      local_27e0 = vandps_avx(auVar146,auVar124);
      auVar92._8_4_ = 0x20;
      auVar92._0_8_ = 0x2000000020;
      auVar92._12_4_ = 0x20;
      auVar92._16_4_ = 0x20;
      auVar92._20_4_ = 0x20;
      auVar92._24_4_ = 0x20;
      auVar92._28_4_ = 0x20;
      auVar211._8_4_ = 0x30;
      auVar211._0_8_ = 0x3000000030;
      auVar211._12_4_ = 0x30;
      auVar211._16_4_ = 0x30;
      auVar211._20_4_ = 0x30;
      auVar211._24_4_ = 0x30;
      auVar211._28_4_ = 0x30;
      auVar218 = ZEXT3264(auVar211);
      auVar124 = ZEXT1632(auVar122);
      auVar146 = vcmpps_avx(local_2820,auVar124,5);
      local_27c0 = vblendvps_avx(auVar211,auVar92,auVar146);
      auVar145._8_4_ = 0x40;
      auVar145._0_8_ = 0x4000000040;
      auVar145._12_4_ = 0x40;
      auVar145._16_4_ = 0x40;
      auVar145._20_4_ = 0x40;
      auVar145._24_4_ = 0x40;
      auVar145._28_4_ = 0x40;
      auVar162._8_4_ = 0x50;
      auVar162._0_8_ = 0x5000000050;
      auVar162._12_4_ = 0x50;
      auVar162._16_4_ = 0x50;
      auVar162._20_4_ = 0x50;
      auVar162._24_4_ = 0x50;
      auVar162._28_4_ = 0x50;
      auVar146 = vcmpps_avx(_local_2800,auVar124,5);
      auVar189 = ZEXT3264(auVar146);
      local_27a0 = vblendvps_avx(auVar162,auVar145,auVar146);
      auVar146 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar124);
      auVar124 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar124);
      local_2740 = vpmovsxwd_avx2(auVar85);
      auVar169 = ZEXT3264(local_2740);
      auVar110._8_4_ = 0x7f800000;
      auVar110._0_8_ = 0x7f8000007f800000;
      auVar110._12_4_ = 0x7f800000;
      auVar110._16_4_ = 0x7f800000;
      auVar110._20_4_ = 0x7f800000;
      auVar110._24_4_ = 0x7f800000;
      auVar110._28_4_ = 0x7f800000;
      local_2780 = vblendvps_avx(auVar110,auVar146,local_2740);
      auVar146._8_4_ = 0xff800000;
      auVar146._0_8_ = 0xff800000ff800000;
      auVar146._12_4_ = 0xff800000;
      auVar146._16_4_ = 0xff800000;
      auVar146._20_4_ = 0xff800000;
      auVar146._24_4_ = 0xff800000;
      auVar146._28_4_ = 0xff800000;
      local_2760 = vblendvps_avx(auVar146,auVar124,local_2740);
      auVar122 = vpcmpeqd_avx(local_2760._0_16_,local_2760._0_16_);
      auVar133 = ZEXT1664(auVar122);
      local_2bc0 = vpmovsxwd_avx2(auVar85 ^ auVar122);
      local_2be8 = This;
      local_2bf0 = (BVH *)This->ptr;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar78 = 5;
      }
      else {
        uVar78 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2d88 = ray + 0x100;
      puVar80 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar76 = (undefined1 (*) [32])local_1e40;
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      local_1e60 = local_2780;
      local_2700 = mm_lookupmask_ps._16_8_;
      uStack_26f8 = mm_lookupmask_ps._24_8_;
      uStack_26f0 = mm_lookupmask_ps._16_8_;
      uStack_26e8 = mm_lookupmask_ps._24_8_;
      local_2c28 = (undefined1 (*) [32])&local_2a40;
      local_2720 = mm_lookupmask_pd._0_8_;
      uStack_2718 = mm_lookupmask_pd._8_8_;
      uStack_2710 = mm_lookupmask_pd._0_8_;
      uStack_2708 = mm_lookupmask_pd._8_8_;
      auVar146 = vpcmpeqd_avx2(local_1e80,local_1e80);
      auVar116 = ZEXT3264(auVar146);
      local_2dd8 = uVar78;
LAB_00548ab1:
      do {
        do {
          root.ptr = puVar80[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0054a46d;
          puVar80 = puVar80 + -1;
          pauVar76 = pauVar76 + -1;
          local_2d20 = *pauVar76;
          auVar158 = ZEXT3264(local_2d20);
          auVar146 = vcmpps_avx(local_2d20,local_2760,1);
        } while ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar146 >> 0x7f,0) == '\0') &&
                   (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar146 >> 0xbf,0) == '\0') &&
                 (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar146[0x1f]);
        uVar81 = vmovmskps_avx(auVar146);
        unaff_R15 = (Geometry *)CONCAT44((int)((ulong)unaff_R15 >> 0x20),uVar81);
        if (uVar78 < CONCAT44(0,POPCOUNT(uVar81))) {
LAB_00548aef:
          do {
            lVar75 = -0x10;
            uVar74 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0054a46d;
              auVar146 = vcmpps_avx(local_2760,auVar158._0_32_,6);
              if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar146 >> 0x7f,0) != '\0') ||
                    (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar146 >> 0xbf,0) != '\0') ||
                  (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar146[0x1f] < '\0') {
                local_2be0 = (ulong)((uint)root.ptr & 0xf) - 8;
                if (local_2be0 == 0) {
                  auVar146 = vpcmpeqd_avx2(auVar133._0_32_,auVar133._0_32_);
                  auVar114 = local_2bc0;
                }
                else {
                  auVar149._0_4_ = local_2bc0._0_4_ ^ auVar116._0_4_;
                  auVar149._4_4_ = local_2bc0._4_4_ ^ auVar116._4_4_;
                  auVar149._8_4_ = local_2bc0._8_4_ ^ auVar116._8_4_;
                  auVar149._12_4_ = local_2bc0._12_4_ ^ auVar116._12_4_;
                  auVar149._16_4_ = local_2bc0._16_4_ ^ auVar116._16_4_;
                  auVar149._20_4_ = local_2bc0._20_4_ ^ auVar116._20_4_;
                  auVar149._24_4_ = local_2bc0._24_4_ ^ auVar116._24_4_;
                  auVar149._28_4_ = local_2bc0._28_4_ ^ auVar116._28_4_;
                  uVar74 = 0;
                  do {
                    auVar116 = ZEXT3264(auVar149);
                    local_2bd8 = uVar74;
                    pGVar77 = (Geometry *)(uVar74 * 0x60 + (root.ptr & 0xfffffffffffffff0));
                    uVar72 = vmovmskps_avx(auVar149);
                    local_2dd0 = CONCAT44((int)(uVar74 >> 0x20),uVar72);
                    uVar10 = 0;
                    for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
                      uVar10 = uVar10 + 1;
                    }
                    local_2bc8 = (ulong)uVar10;
                    local_2dc8 = 0;
                    for (uVar74 = local_2dd0; (uVar74 & 1) == 0;
                        uVar74 = uVar74 >> 1 | 0x8000000000000000) {
                      local_2dc8 = local_2dc8 + 1;
                    }
                    auVar158 = ZEXT3264(auVar149);
                    pGVar79 = (Geometry *)0x0;
                    local_2d80 = auVar149;
                    while( true ) {
                      fVar135 = auVar218._28_4_;
                      fVar83 = auVar189._28_4_;
                      auVar255 = auVar259._0_28_;
                      auVar260 = auVar158._0_28_;
                      auVar146 = auVar158._0_32_;
                      auVar150 = auVar116._0_32_;
                      auVar282 = in_ZMM14._0_28_;
                      auVar281 = in_ZMM13._0_28_;
                      iVar71 = *(int *)((long)&pGVar77->pointQueryFunc + (long)pGVar79 * 4);
                      if (iVar71 == -1) break;
                      local_2bd0 = (ulong)*(uint *)((long)&pGVar77->intersectionFilterN +
                                                   (long)pGVar79 * 4);
                      pGVar6 = (context->scene->geometries).items[local_2bd0].ptr;
                      BVar2 = pGVar6->time_range;
                      auVar85._8_8_ = 0;
                      auVar85._0_4_ = BVar2.lower;
                      auVar85._4_4_ = BVar2.upper;
                      fVar99 = BVar2.lower;
                      auVar104._4_4_ = fVar99;
                      auVar104._0_4_ = fVar99;
                      auVar104._8_4_ = fVar99;
                      auVar104._12_4_ = fVar99;
                      auVar104._16_4_ = fVar99;
                      auVar104._20_4_ = fVar99;
                      auVar104._24_4_ = fVar99;
                      auVar104._28_4_ = fVar99;
                      auVar124 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar104);
                      auVar122 = vmovshdup_avx(auVar85);
                      auVar122 = vsubps_avx(auVar122,auVar85);
                      auVar86._0_4_ = auVar122._0_4_;
                      auVar86._4_4_ = auVar86._0_4_;
                      auVar86._8_4_ = auVar86._0_4_;
                      auVar86._12_4_ = auVar86._0_4_;
                      auVar86._16_4_ = auVar86._0_4_;
                      auVar86._20_4_ = auVar86._0_4_;
                      auVar86._24_4_ = auVar86._0_4_;
                      auVar86._28_4_ = auVar86._0_4_;
                      auVar124 = vdivps_avx(auVar124,auVar86);
                      fVar99 = pGVar6->fnumTimeSegments;
                      auVar15._4_4_ = fVar99 * auVar124._4_4_;
                      auVar15._0_4_ = fVar99 * auVar124._0_4_;
                      auVar15._8_4_ = fVar99 * auVar124._8_4_;
                      auVar15._12_4_ = fVar99 * auVar124._12_4_;
                      auVar15._16_4_ = fVar99 * auVar124._16_4_;
                      auVar15._20_4_ = fVar99 * auVar124._20_4_;
                      auVar15._24_4_ = fVar99 * auVar124._24_4_;
                      auVar15._28_4_ = auVar124._28_4_;
                      auVar124 = vroundps_avx(auVar15,1);
                      fVar99 = fVar99 + -1.0;
                      auVar105._4_4_ = fVar99;
                      auVar105._0_4_ = fVar99;
                      auVar105._8_4_ = fVar99;
                      auVar105._12_4_ = fVar99;
                      auVar105._16_4_ = fVar99;
                      auVar105._20_4_ = fVar99;
                      auVar105._24_4_ = fVar99;
                      auVar105._28_4_ = fVar99;
                      auVar124 = vminps_avx(auVar124,auVar105);
                      auVar124 = vmaxps_avx(auVar124,_DAT_01faff00);
                      auVar110 = vsubps_avx(auVar15,auVar124);
                      local_2d00 = vcvtps2dq_avx(auVar124);
                      iVar3 = *(int *)(local_2d00 + local_2bc8 * 4);
                      aRVar125._4_4_ = iVar3;
                      aRVar125._0_4_ = iVar3;
                      aRVar125._8_4_ = iVar3;
                      aRVar125._12_4_ = iVar3;
                      aRVar125._16_4_ = iVar3;
                      aRVar125._20_4_ = iVar3;
                      aRVar125._24_4_ = iVar3;
                      aRVar125._28_4_ = iVar3;
                      auVar124 = vpcmpeqd_avx2((undefined1  [32])aRVar125,local_2d00);
                      auVar124 = auVar150 & ~auVar124;
                      local_2c80 = auVar146;
                      local_2b40._0_8_ = pGVar6;
                      fVar101 = auVar110._4_4_;
                      fVar98 = auVar110._8_4_;
                      fVar100 = auVar110._12_4_;
                      fVar102 = auVar110._16_4_;
                      fVar84 = auVar110._20_4_;
                      fVar137 = auVar110._24_4_;
                      fVar99 = auVar110._0_4_;
                      auVar218._28_36_ = in_ZMM15._28_36_;
                      auVar189._28_36_ = in_ZMM11._28_36_;
                      if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar124 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar124 >> 0x7f,0) == '\0') &&
                            (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar124 >> 0xbf,0) == '\0') &&
                          (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar124[0x1f]) {
                        lVar75 = *(long *)(*(long *)&pGVar6[2].numPrimitives + (long)iVar3 * 0x38);
                        lVar7 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 +
                                         (long)iVar3 * 0x38);
                        uVar74 = (ulong)*(uint *)((long)&(pGVar77->super_RefCount)._vptr_RefCount +
                                                 (long)pGVar79 * 4);
                        uVar81 = *(undefined4 *)(lVar75 + uVar74 * 4);
                        auVar184._4_4_ = uVar81;
                        auVar184._0_4_ = uVar81;
                        auVar184._8_4_ = uVar81;
                        auVar184._12_4_ = uVar81;
                        auVar184._16_4_ = uVar81;
                        auVar184._20_4_ = uVar81;
                        auVar184._24_4_ = uVar81;
                        auVar184._28_4_ = uVar81;
                        uVar81 = *(undefined4 *)(lVar75 + 4 + uVar74 * 4);
                        auVar213._4_4_ = uVar81;
                        auVar213._0_4_ = uVar81;
                        auVar213._8_4_ = uVar81;
                        auVar213._12_4_ = uVar81;
                        auVar213._16_4_ = uVar81;
                        auVar213._20_4_ = uVar81;
                        auVar213._24_4_ = uVar81;
                        auVar213._28_4_ = uVar81;
                        uVar81 = *(undefined4 *)(lVar75 + 8 + uVar74 * 4);
                        auVar229._4_4_ = uVar81;
                        auVar229._0_4_ = uVar81;
                        auVar229._8_4_ = uVar81;
                        auVar229._12_4_ = uVar81;
                        auVar229._16_4_ = uVar81;
                        auVar229._20_4_ = uVar81;
                        auVar229._24_4_ = uVar81;
                        auVar229._28_4_ = uVar81;
                        fVar83 = *(float *)(lVar7 + uVar74 * 4);
                        fVar135 = *(float *)(lVar7 + 4 + uVar74 * 4);
                        fVar139 = *(float *)(lVar7 + 8 + uVar74 * 4);
                        uVar74 = (ulong)*(uint *)((long)&pGVar77->device + (long)pGVar79 * 4);
                        auVar106._8_4_ = 0x3f800000;
                        auVar106._0_8_ = 0x3f8000003f800000;
                        auVar106._12_4_ = 0x3f800000;
                        auVar106._16_4_ = 0x3f800000;
                        auVar106._20_4_ = 0x3f800000;
                        auVar106._24_4_ = 0x3f800000;
                        auVar106._28_4_ = 0x3f800000;
                        auVar146 = vsubps_avx(auVar106,auVar110);
                        auVar218._0_4_ = fVar99 * fVar83;
                        auVar218._4_4_ = fVar101 * fVar83;
                        auVar218._8_4_ = fVar98 * fVar83;
                        auVar218._12_4_ = fVar100 * fVar83;
                        auVar218._16_4_ = fVar102 * fVar83;
                        auVar218._20_4_ = fVar84 * fVar83;
                        auVar218._24_4_ = fVar137 * fVar83;
                        auVar16._4_4_ = fVar101 * fVar135;
                        auVar16._0_4_ = fVar99 * fVar135;
                        auVar16._8_4_ = fVar98 * fVar135;
                        auVar16._12_4_ = fVar100 * fVar135;
                        auVar16._16_4_ = fVar102 * fVar135;
                        auVar16._20_4_ = fVar84 * fVar135;
                        auVar16._24_4_ = fVar137 * fVar135;
                        auVar16._28_4_ = fVar135;
                        auVar17._4_4_ = fVar101 * fVar139;
                        auVar17._0_4_ = fVar99 * fVar139;
                        auVar17._8_4_ = fVar98 * fVar139;
                        auVar17._12_4_ = fVar100 * fVar139;
                        auVar17._16_4_ = fVar102 * fVar139;
                        auVar17._20_4_ = fVar84 * fVar139;
                        auVar17._24_4_ = fVar137 * fVar139;
                        auVar17._28_4_ = fVar139;
                        auVar122 = vfmadd231ps_fma(auVar218._0_32_,auVar146,auVar184);
                        auVar133 = ZEXT1664(auVar122);
                        auVar122 = vfmadd231ps_fma(auVar16,auVar146,auVar213);
                        auVar157 = ZEXT1632(auVar122);
                        auVar122 = vfmadd231ps_fma(auVar17,auVar146,auVar229);
                        auVar168 = ZEXT1632(auVar122);
                        uVar81 = *(undefined4 *)(lVar75 + uVar74 * 4);
                        auVar185._4_4_ = uVar81;
                        auVar185._0_4_ = uVar81;
                        auVar185._8_4_ = uVar81;
                        auVar185._12_4_ = uVar81;
                        auVar185._16_4_ = uVar81;
                        auVar185._20_4_ = uVar81;
                        auVar185._24_4_ = uVar81;
                        auVar185._28_4_ = uVar81;
                        uVar81 = *(undefined4 *)(lVar75 + 4 + uVar74 * 4);
                        auVar214._4_4_ = uVar81;
                        auVar214._0_4_ = uVar81;
                        auVar214._8_4_ = uVar81;
                        auVar214._12_4_ = uVar81;
                        auVar214._16_4_ = uVar81;
                        auVar214._20_4_ = uVar81;
                        auVar214._24_4_ = uVar81;
                        auVar214._28_4_ = uVar81;
                        uVar81 = *(undefined4 *)(lVar75 + 8 + uVar74 * 4);
                        auVar230._4_4_ = uVar81;
                        auVar230._0_4_ = uVar81;
                        auVar230._8_4_ = uVar81;
                        auVar230._12_4_ = uVar81;
                        auVar230._16_4_ = uVar81;
                        auVar230._20_4_ = uVar81;
                        auVar230._24_4_ = uVar81;
                        auVar230._28_4_ = uVar81;
                        fVar135 = *(float *)(lVar7 + uVar74 * 4);
                        fVar139 = *(float *)(lVar7 + 4 + uVar74 * 4);
                        fVar141 = *(float *)(lVar7 + 8 + uVar74 * 4);
                        auVar18._4_4_ = fVar135 * fVar101;
                        auVar18._0_4_ = fVar135 * fVar99;
                        auVar18._8_4_ = fVar135 * fVar98;
                        auVar18._12_4_ = fVar135 * fVar100;
                        auVar18._16_4_ = fVar135 * fVar102;
                        auVar18._20_4_ = fVar135 * fVar84;
                        auVar18._24_4_ = fVar135 * fVar137;
                        auVar18._28_4_ = fVar83;
                        auVar19._4_4_ = fVar139 * fVar101;
                        auVar19._0_4_ = fVar139 * fVar99;
                        auVar19._8_4_ = fVar139 * fVar98;
                        auVar19._12_4_ = fVar139 * fVar100;
                        auVar19._16_4_ = fVar139 * fVar102;
                        auVar19._20_4_ = fVar139 * fVar84;
                        auVar19._24_4_ = fVar139 * fVar137;
                        auVar19._28_4_ = fVar135;
                        auVar189._0_4_ = fVar141 * fVar99;
                        auVar189._4_4_ = fVar141 * fVar101;
                        auVar189._8_4_ = fVar141 * fVar98;
                        auVar189._12_4_ = fVar141 * fVar100;
                        auVar189._16_4_ = fVar141 * fVar102;
                        auVar189._20_4_ = fVar141 * fVar84;
                        auVar189._24_4_ = fVar141 * fVar137;
                        auVar122 = vfmadd231ps_fma(auVar18,auVar146,auVar185);
                        _local_2c60 = ZEXT1632(auVar122);
                        auVar122 = vfmadd231ps_fma(auVar19,auVar146,auVar214);
                        _local_2dc0 = ZEXT1632(auVar122);
                        uVar74 = (ulong)(&pGVar77->numPrimitives)[(long)pGVar79];
                        uVar81 = *(undefined4 *)(lVar75 + uVar74 * 4);
                        auVar186._4_4_ = uVar81;
                        auVar186._0_4_ = uVar81;
                        auVar186._8_4_ = uVar81;
                        auVar186._12_4_ = uVar81;
                        auVar186._16_4_ = uVar81;
                        auVar186._20_4_ = uVar81;
                        auVar186._24_4_ = uVar81;
                        auVar186._28_4_ = uVar81;
                        uVar81 = *(undefined4 *)(lVar75 + 4 + uVar74 * 4);
                        auVar215._4_4_ = uVar81;
                        auVar215._0_4_ = uVar81;
                        auVar215._8_4_ = uVar81;
                        auVar215._12_4_ = uVar81;
                        auVar215._16_4_ = uVar81;
                        auVar215._20_4_ = uVar81;
                        auVar215._24_4_ = uVar81;
                        auVar215._28_4_ = uVar81;
                        uVar81 = *(undefined4 *)(lVar75 + 8 + uVar74 * 4);
                        auVar243._4_4_ = uVar81;
                        auVar243._0_4_ = uVar81;
                        auVar243._8_4_ = uVar81;
                        auVar243._12_4_ = uVar81;
                        auVar243._16_4_ = uVar81;
                        auVar243._20_4_ = uVar81;
                        auVar243._24_4_ = uVar81;
                        auVar243._28_4_ = uVar81;
                        fVar83 = *(float *)(lVar7 + uVar74 * 4);
                        fVar135 = *(float *)(lVar7 + 4 + uVar74 * 4);
                        auVar122 = vfmadd231ps_fma(auVar189._0_32_,auVar146,auVar230);
                        auVar271 = (undefined1  [36])0x0;
                        _local_2d40 = ZEXT1632(auVar122);
                        fVar139 = *(float *)(lVar7 + 8 + uVar74 * 4);
                        auVar20._4_4_ = fVar83 * fVar101;
                        auVar20._0_4_ = fVar83 * fVar99;
                        auVar20._8_4_ = fVar83 * fVar98;
                        auVar20._12_4_ = fVar83 * fVar100;
                        auVar20._16_4_ = fVar83 * fVar102;
                        auVar20._20_4_ = fVar83 * fVar84;
                        auVar20._24_4_ = fVar83 * fVar137;
                        auVar20._28_4_ = fVar83;
                        auVar21._4_4_ = fVar135 * fVar101;
                        auVar21._0_4_ = fVar135 * fVar99;
                        auVar21._8_4_ = fVar135 * fVar98;
                        auVar21._12_4_ = fVar135 * fVar100;
                        auVar21._16_4_ = fVar135 * fVar102;
                        auVar21._20_4_ = fVar135 * fVar84;
                        auVar21._24_4_ = fVar135 * fVar137;
                        auVar21._28_4_ = fVar135;
                        auVar22._4_4_ = fVar101 * fVar139;
                        auVar22._0_4_ = fVar99 * fVar139;
                        auVar22._8_4_ = fVar98 * fVar139;
                        auVar22._12_4_ = fVar100 * fVar139;
                        auVar22._16_4_ = fVar102 * fVar139;
                        auVar22._20_4_ = fVar84 * fVar139;
                        auVar22._24_4_ = fVar137 * fVar139;
                        auVar22._28_4_ = fVar139;
                        auVar122 = vfmadd231ps_fma(auVar20,auVar146,auVar186);
                        local_2b60 = ZEXT1632(auVar122);
                        auVar122 = vfmadd231ps_fma(auVar21,auVar146,auVar215);
                        _local_2940 = ZEXT1632(auVar122);
                        auVar122 = vfmadd231ps_fma(auVar22,auVar146,auVar243);
                        _local_2960 = ZEXT1632(auVar122);
                        uVar74 = (ulong)(uint)(&(pGVar77->time_range).upper)[(long)pGVar79];
                        uVar81 = *(undefined4 *)(lVar75 + uVar74 * 4);
                        auVar187._4_4_ = uVar81;
                        auVar187._0_4_ = uVar81;
                        auVar187._8_4_ = uVar81;
                        auVar187._12_4_ = uVar81;
                        auVar187._16_4_ = uVar81;
                        auVar187._20_4_ = uVar81;
                        auVar187._24_4_ = uVar81;
                        auVar187._28_4_ = uVar81;
                        fVar83 = *(float *)(lVar7 + uVar74 * 4);
                        fVar135 = *(float *)(lVar7 + 4 + uVar74 * 4);
                        fVar139 = *(float *)(lVar7 + 8 + uVar74 * 4);
                        auVar257._0_4_ = fVar99 * fVar83;
                        auVar257._4_4_ = fVar101 * fVar83;
                        auVar257._8_4_ = fVar98 * fVar83;
                        auVar257._12_4_ = fVar100 * fVar83;
                        auVar257._16_4_ = fVar102 * fVar83;
                        auVar257._20_4_ = fVar84 * fVar83;
                        auVar257._24_4_ = fVar137 * fVar83;
                        auVar257._28_4_ = 0;
                        auVar262._0_4_ = fVar99 * fVar135;
                        auVar262._4_4_ = fVar101 * fVar135;
                        auVar262._8_4_ = fVar98 * fVar135;
                        auVar262._12_4_ = fVar100 * fVar135;
                        auVar262._16_4_ = fVar102 * fVar135;
                        auVar262._20_4_ = fVar84 * fVar135;
                        auVar262._24_4_ = fVar137 * fVar135;
                        auVar262._28_4_ = 0;
                        auVar23._4_4_ = fVar139 * fVar101;
                        auVar23._0_4_ = fVar139 * fVar99;
                        auVar23._8_4_ = fVar139 * fVar98;
                        auVar23._12_4_ = fVar139 * fVar100;
                        auVar23._16_4_ = fVar139 * fVar102;
                        auVar23._20_4_ = fVar139 * fVar84;
                        auVar23._24_4_ = fVar139 * fVar137;
                        auVar23._28_4_ = fVar135;
                        auVar122 = vfmadd231ps_fma(auVar257,auVar146,auVar187);
                        local_2640 = ZEXT1632(auVar122);
                        uVar81 = *(undefined4 *)(lVar75 + 4 + uVar74 * 4);
                        auVar87._4_4_ = uVar81;
                        auVar87._0_4_ = uVar81;
                        auVar87._8_4_ = uVar81;
                        auVar87._12_4_ = uVar81;
                        auVar87._16_4_ = uVar81;
                        auVar87._20_4_ = uVar81;
                        auVar87._24_4_ = uVar81;
                        auVar87._28_4_ = uVar81;
                        auVar122 = vfmadd231ps_fma(auVar262,auVar146,auVar87);
                        local_2660 = ZEXT1632(auVar122);
                        uVar81 = *(undefined4 *)(lVar75 + 8 + uVar74 * 4);
                        auVar88._4_4_ = uVar81;
                        auVar88._0_4_ = uVar81;
                        auVar88._8_4_ = uVar81;
                        auVar88._12_4_ = uVar81;
                        auVar88._16_4_ = uVar81;
                        auVar88._20_4_ = uVar81;
                        auVar88._24_4_ = uVar81;
                        auVar88._28_4_ = uVar81;
                        auVar122 = vfmadd231ps_fma(auVar23,auVar146,auVar88);
                        local_2680 = ZEXT1632(auVar122);
                        unaff_R15 = pGVar77;
                      }
                      else {
                        if (local_2dd0 != 0) {
                          lVar75 = *(long *)&pGVar6[2].numPrimitives;
                          uVar73 = (ulong)*(uint *)((long)&(pGVar77->super_RefCount)._vptr_RefCount
                                                   + (long)pGVar79 * 4);
                          uVar74 = local_2dd0;
                          uVar78 = local_2dc8;
                          do {
                            auVar122 = *(undefined1 (*) [16])
                                        (*(long *)(lVar75 + (long)*(int *)(local_2d00 + uVar78 * 4)
                                                            * 0x38) + uVar73 * 4);
                            auVar85 = *(undefined1 (*) [16])
                                       (*(long *)(lVar75 + 0x38 +
                                                 (long)*(int *)(local_2d00 + uVar78 * 4) * 0x38) +
                                       uVar73 * 4);
                            *(int *)(local_2b20 + uVar78 * 4) = auVar122._0_4_;
                            uVar81 = vextractps_avx(auVar122,1);
                            *(undefined4 *)(local_2b00 + uVar78 * 4) = uVar81;
                            uVar81 = vextractps_avx(auVar122,2);
                            *(undefined4 *)(local_2ae0 + uVar78 * 4) = uVar81;
                            *(int *)(local_2ce0 + uVar78 * 4) = auVar85._0_4_;
                            uVar81 = vextractps_avx(auVar85,1);
                            *(undefined4 *)((long)&local_2cc0 + uVar78 * 4) = uVar81;
                            fVar139 = (float)vextractps_avx(auVar85,2);
                            local_2ca0[uVar78] = fVar139;
                            uVar74 = uVar74 ^ 1L << (uVar78 & 0x3f);
                            uVar78 = 0;
                            for (uVar5 = uVar74; (uVar5 & 1) == 0;
                                uVar5 = uVar5 >> 1 | 0x8000000000000000) {
                              uVar78 = uVar78 + 1;
                            }
                          } while (uVar74 != 0);
                          auVar150._8_8_ = local_2ce0._8_8_;
                          auVar150._0_8_ = local_2ce0._0_8_;
                          auVar150._16_8_ = local_2ce0._16_8_;
                          auVar150._24_8_ = local_2ce0._24_8_;
                          unaff_R15 = pGVar77;
                          aRVar125 = local_2b20;
                        }
                        auVar112._8_4_ = 0x3f800000;
                        auVar112._0_8_ = 0x3f8000003f800000;
                        auVar112._12_4_ = 0x3f800000;
                        auVar112._16_4_ = 0x3f800000;
                        auVar112._20_4_ = 0x3f800000;
                        auVar112._24_4_ = 0x3f800000;
                        auVar112._28_4_ = 0x3f800000;
                        auVar146 = vsubps_avx(auVar112,auVar110);
                        fVar139 = auVar146._0_4_;
                        fVar264 = fVar139 * (float)local_2b00._0_4_;
                        fVar141 = auVar146._4_4_;
                        fVar265 = fVar141 * (float)local_2b00._4_4_;
                        fVar143 = auVar146._8_4_;
                        fVar266 = fVar143 * fStack_2af8;
                        fVar117 = auVar146._12_4_;
                        fVar267 = fVar117 * fStack_2af4;
                        fVar118 = auVar146._16_4_;
                        fVar268 = fVar118 * fStack_2af0;
                        fVar119 = auVar146._20_4_;
                        fVar269 = fVar119 * fStack_2aec;
                        fVar120 = auVar146._24_4_;
                        fVar270 = fVar120 * fStack_2ae8;
                        fVar272 = fVar139 * (float)local_2ae0._0_4_;
                        fVar275 = fVar141 * (float)local_2ae0._4_4_;
                        fVar276 = fVar143 * fStack_2ad8;
                        fVar277 = fVar117 * fStack_2ad4;
                        fVar278 = fVar118 * fStack_2ad0;
                        fVar279 = fVar119 * fStack_2acc;
                        fVar280 = fVar120 * fStack_2ac8;
                        fVar159 = fVar99 * (float)local_2cc0;
                        fVar170 = fVar101 * local_2cc0._4_4_;
                        fVar172 = fVar98 * fStack_2cb8;
                        fVar134 = fVar100 * fStack_2cb4;
                        fVar138 = fVar102 * fStack_2cb0;
                        fVar142 = fVar84 * fStack_2cac;
                        fVar173 = fVar137 * fStack_2ca8;
                        fVar160 = fVar99 * local_2ca0[0];
                        fVar171 = fVar101 * local_2ca0[1];
                        fVar121 = fVar98 * local_2ca0[2];
                        fVar136 = fVar100 * local_2ca0[3];
                        fVar140 = fVar102 * fStack_2c90;
                        fVar144 = fVar84 * fStack_2c8c;
                        fVar174 = fVar137 * fStack_2c88;
                        if (local_2dd0 != 0) {
                          lVar75 = *(long *)&pGVar6[2].numPrimitives;
                          uVar73 = (ulong)*(uint *)((long)&pGVar77->device + (long)pGVar79 * 4);
                          uVar74 = local_2dd0;
                          uVar78 = local_2dc8;
                          do {
                            auVar122 = *(undefined1 (*) [16])
                                        (*(long *)(lVar75 + (long)*(int *)(local_2d00 + uVar78 * 4)
                                                            * 0x38) + uVar73 * 4);
                            auVar85 = *(undefined1 (*) [16])
                                       (*(long *)(lVar75 + 0x38 +
                                                 (long)*(int *)(local_2d00 + uVar78 * 4) * 0x38) +
                                       uVar73 * 4);
                            fVar135 = 0.0;
                            *(int *)(local_2b20 + uVar78 * 4) = auVar122._0_4_;
                            uVar81 = vextractps_avx(auVar122,1);
                            *(undefined4 *)(local_2b00 + uVar78 * 4) = uVar81;
                            uVar81 = vextractps_avx(auVar122,2);
                            *(undefined4 *)(local_2ae0 + uVar78 * 4) = uVar81;
                            *(int *)(local_2ce0 + uVar78 * 4) = auVar85._0_4_;
                            uVar81 = vextractps_avx(auVar85,1);
                            *(undefined4 *)((long)&local_2cc0 + uVar78 * 4) = uVar81;
                            fVar83 = (float)vextractps_avx(auVar85,2);
                            local_2ca0[uVar78] = fVar83;
                            uVar74 = uVar74 ^ 1L << (uVar78 & 0x3f);
                            uVar78 = 0;
                            for (uVar5 = uVar74; (uVar5 & 1) == 0;
                                uVar5 = uVar5 >> 1 | 0x8000000000000000) {
                              uVar78 = uVar78 + 1;
                            }
                          } while (uVar74 != 0);
                          local_2ba0[0] = local_2b20[0];
                          local_2ba0[1] = local_2b20[1];
                          local_2ba0[2] = local_2b20[2];
                          local_2ba0[3] = local_2b20[3];
                          local_2ba0[4] = local_2b20[4];
                          local_2ba0[5] = local_2b20[5];
                          local_2ba0[6] = local_2b20[6];
                          local_2ba0[7] = local_2b20[7];
                          fStack_2b98._0_1_ = local_2b20[8];
                          fStack_2b98._1_1_ = local_2b20[9];
                          fStack_2b98._2_1_ = local_2b20[10];
                          fStack_2b98._3_1_ = local_2b20[0xb];
                          fStack_2b94._0_1_ = local_2b20[0xc];
                          fStack_2b94._1_1_ = local_2b20[0xd];
                          fStack_2b94._2_1_ = local_2b20[0xe];
                          fStack_2b94._3_1_ = local_2b20[0xf];
                          fStack_2b90._0_1_ = local_2b20[0x10];
                          fStack_2b90._1_1_ = local_2b20[0x11];
                          fStack_2b90._2_1_ = local_2b20[0x12];
                          fStack_2b90._3_1_ = local_2b20[0x13];
                          fStack_2b8c._0_1_ = local_2b20[0x14];
                          fStack_2b8c._1_1_ = local_2b20[0x15];
                          fStack_2b8c._2_1_ = local_2b20[0x16];
                          fStack_2b8c._3_1_ = local_2b20[0x17];
                          fStack_2b88._0_1_ = local_2b20[0x18];
                          fStack_2b88._1_1_ = local_2b20[0x19];
                          fStack_2b88._2_1_ = local_2b20[0x1a];
                          fStack_2b88._3_1_ = local_2b20[0x1b];
                          uStack_2b84 = local_2b20[0x1c];
                          uStack_2b83 = local_2b20[0x1d];
                          uStack_2b82 = local_2b20[0x1e];
                          uStack_2b81 = local_2b20[0x1f];
                          unique0x1000e1d9 = local_2ce0._8_8_;
                          local_2c60 = (undefined1  [8])local_2ce0._0_8_;
                          unique0x1000e1e1 = local_2ce0._16_8_;
                          unique0x1000e1e9 = local_2ce0._24_8_;
                          fVar83 = SUB84(local_2ce0._24_8_,4);
                          unaff_R15 = pGVar77;
                        }
                        fVar175 = fVar139 * (float)local_2b00._0_4_;
                        fVar190 = fVar141 * (float)local_2b00._4_4_;
                        fVar193 = fVar143 * fStack_2af8;
                        fVar196 = fVar117 * fStack_2af4;
                        fVar199 = fVar118 * fStack_2af0;
                        fVar202 = fVar119 * fStack_2aec;
                        fVar205 = fVar120 * fStack_2ae8;
                        fVar176 = fVar139 * (float)local_2ae0._0_4_;
                        fVar191 = fVar141 * (float)local_2ae0._4_4_;
                        fVar194 = fVar143 * fStack_2ad8;
                        fVar197 = fVar117 * fStack_2ad4;
                        fVar200 = fVar118 * fStack_2ad0;
                        fVar203 = fVar119 * fStack_2acc;
                        fVar206 = fVar120 * fStack_2ac8;
                        local_2c20._4_4_ = fVar101 * local_2cc0._4_4_;
                        local_2c20._0_4_ = fVar99 * (float)local_2cc0;
                        fStack_2c18 = fVar98 * fStack_2cb8;
                        fStack_2c14 = fVar100 * fStack_2cb4;
                        fStack_2c10 = fVar102 * fStack_2cb0;
                        fStack_2c0c = fVar84 * fStack_2cac;
                        fStack_2c08 = fVar137 * fStack_2ca8;
                        fStack_2c04 = fVar83;
                        local_2b80._4_4_ = fVar101 * local_2ca0[1];
                        local_2b80._0_4_ = fVar99 * local_2ca0[0];
                        fStack_2b78 = fVar98 * local_2ca0[2];
                        fStack_2b74 = fVar100 * local_2ca0[3];
                        fStack_2b70 = fVar102 * fStack_2c90;
                        fStack_2b6c = fVar84 * fStack_2c8c;
                        fStack_2b68 = fVar137 * fStack_2c88;
                        fStack_2b64 = fVar83;
                        fVar208 = fVar83;
                        if (local_2dd0 != 0) {
                          lVar75 = *(long *)&pGVar6[2].numPrimitives;
                          uVar10 = (&pGVar77->numPrimitives)[(long)pGVar79];
                          uVar74 = local_2dd0;
                          uVar78 = local_2dc8;
                          do {
                            auVar122 = *(undefined1 (*) [16])
                                        (*(long *)(lVar75 + (long)*(int *)(local_2d00 + uVar78 * 4)
                                                            * 0x38) + (ulong)uVar10 * 4);
                            fVar208 = 0.0;
                            auVar85 = *(undefined1 (*) [16])
                                       (*(long *)(lVar75 + 0x38 +
                                                 (long)*(int *)(local_2d00 + uVar78 * 4) * 0x38) +
                                       (ulong)uVar10 * 4);
                            fVar135 = 0.0;
                            *(int *)(local_2b20 + uVar78 * 4) = auVar122._0_4_;
                            uVar81 = vextractps_avx(auVar122,1);
                            *(undefined4 *)(local_2b00 + uVar78 * 4) = uVar81;
                            uVar81 = vextractps_avx(auVar122,2);
                            *(undefined4 *)(local_2ae0 + uVar78 * 4) = uVar81;
                            *(int *)(local_2ce0 + uVar78 * 4) = auVar85._0_4_;
                            uVar81 = vextractps_avx(auVar85,1);
                            *(undefined4 *)((long)&local_2cc0 + uVar78 * 4) = uVar81;
                            fVar177 = (float)vextractps_avx(auVar85,2);
                            local_2ca0[uVar78] = fVar177;
                            uVar74 = uVar74 ^ 1L << (uVar78 & 0x3f);
                            uVar78 = 0;
                            for (uVar73 = uVar74; (uVar73 & 1) == 0;
                                uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                              uVar78 = uVar78 + 1;
                            }
                          } while (uVar74 != 0);
                          auVar281 = local_2b20._0_28_;
                          auVar64._8_8_ = local_2ce0._8_8_;
                          auVar64._0_8_ = local_2ce0._0_8_;
                          auVar64._16_8_ = local_2ce0._16_8_;
                          auVar64._24_8_ = local_2ce0._24_8_;
                          auVar282 = auVar64._0_28_;
                          unaff_R15 = pGVar77;
                        }
                        fVar177 = fVar139 * (float)local_2b00._0_4_;
                        fVar192 = fVar141 * (float)local_2b00._4_4_;
                        fVar195 = fVar143 * fStack_2af8;
                        fVar198 = fVar117 * fStack_2af4;
                        fVar201 = fVar118 * fStack_2af0;
                        fVar204 = fVar119 * fStack_2aec;
                        fVar207 = fVar120 * fStack_2ae8;
                        fVar209 = fVar139 * (float)local_2ae0._0_4_;
                        fVar219 = fVar141 * (float)local_2ae0._4_4_;
                        fVar220 = fVar143 * fStack_2ad8;
                        fVar221 = fVar117 * fStack_2ad4;
                        fVar222 = fVar118 * fStack_2ad0;
                        fVar223 = fVar119 * fStack_2acc;
                        fVar224 = fVar120 * fStack_2ac8;
                        fVar225 = fVar99 * (float)local_2cc0;
                        fVar234 = fVar101 * local_2cc0._4_4_;
                        fVar235 = fVar98 * fStack_2cb8;
                        fVar236 = fVar100 * fStack_2cb4;
                        fVar237 = fVar102 * fStack_2cb0;
                        fVar238 = fVar84 * fStack_2cac;
                        fVar239 = fVar137 * fStack_2ca8;
                        fVar240 = fVar99 * local_2ca0[0];
                        fVar249 = fVar101 * local_2ca0[1];
                        fVar250 = fVar98 * local_2ca0[2];
                        fVar251 = fVar100 * local_2ca0[3];
                        fVar252 = fVar102 * fStack_2c90;
                        fVar253 = fVar84 * fStack_2c8c;
                        fVar254 = fVar137 * fStack_2c88;
                        if (local_2dd0 != 0) {
                          lVar75 = *(long *)(local_2b40._0_8_ + 0xe0);
                          uVar73 = (ulong)(uint)(&(pGVar77->time_range).upper)[(long)pGVar79];
                          uVar74 = local_2dd0;
                          uVar78 = local_2dc8;
                          do {
                            auVar122 = *(undefined1 (*) [16])
                                        (*(long *)(lVar75 + (long)*(int *)(local_2d00 + uVar78 * 4)
                                                            * 0x38) + uVar73 * 4);
                            auVar85 = *(undefined1 (*) [16])
                                       (*(long *)(lVar75 + 0x38 +
                                                 (long)*(int *)(local_2d00 + uVar78 * 4) * 0x38) +
                                       uVar73 * 4);
                            *(int *)(local_2b20 + uVar78 * 4) = auVar122._0_4_;
                            uVar81 = vextractps_avx(auVar122,1);
                            *(undefined4 *)(local_2b00 + uVar78 * 4) = uVar81;
                            uVar81 = vextractps_avx(auVar122,2);
                            *(undefined4 *)(local_2ae0 + uVar78 * 4) = uVar81;
                            *(int *)(local_2ce0 + uVar78 * 4) = auVar85._0_4_;
                            uVar81 = vextractps_avx(auVar85,1);
                            *(undefined4 *)((long)&local_2cc0 + uVar78 * 4) = uVar81;
                            fVar4 = (float)vextractps_avx(auVar85,2);
                            local_2ca0[uVar78] = fVar4;
                            uVar74 = uVar74 ^ 1L << (uVar78 & 0x3f);
                            uVar78 = 0;
                            for (uVar5 = uVar74; (uVar5 & 1) == 0;
                                uVar5 = uVar5 >> 1 | 0x8000000000000000) {
                              uVar78 = uVar78 + 1;
                            }
                          } while (uVar74 != 0);
                          auVar260 = local_2b20._0_28_;
                          auVar65._8_8_ = local_2ce0._8_8_;
                          auVar65._0_8_ = local_2ce0._0_8_;
                          auVar65._16_8_ = local_2ce0._16_8_;
                          auVar65._24_8_ = local_2ce0._24_8_;
                          auVar255 = auVar65._0_28_;
                          unaff_R15 = pGVar79;
                        }
                        auVar133 = ZEXT3264(CONCAT428(aRVar125._28_4_ + auVar150._28_4_,
                                                      CONCAT424(fVar120 * aRVar125._24_4_ +
                                                                fVar137 * auVar150._24_4_,
                                                                CONCAT420(fVar119 * aRVar125._20_4_
                                                                          + fVar84 * auVar150._20_4_
                                                                          ,CONCAT416(fVar118 * 
                                                  aRVar125._16_4_ + fVar102 * auVar150._16_4_,
                                                  CONCAT412(fVar117 * aRVar125._12_4_ +
                                                            fVar100 * auVar150._12_4_,
                                                            CONCAT48(fVar143 * aRVar125._8_4_ +
                                                                     fVar98 * auVar150._8_4_,
                                                                     CONCAT44(fVar141 * aRVar125.
                                                  _4_4_ + fVar101 * auVar150._4_4_,
                                                  fVar139 * aRVar125._0_4_ + fVar99 * auVar150._0_4_
                                                  ))))))));
                        auVar157._0_4_ = fVar264 + fVar159;
                        auVar157._4_4_ = fVar265 + fVar170;
                        auVar157._8_4_ = fVar266 + fVar172;
                        auVar157._12_4_ = fVar267 + fVar134;
                        auVar157._16_4_ = fVar268 + fVar138;
                        auVar157._20_4_ = fVar269 + fVar142;
                        auVar157._24_4_ = fVar270 + fVar173;
                        fVar159 = in_ZMM11._28_4_;
                        auVar157._28_4_ = fVar159 + auVar169._28_4_;
                        auVar168._0_4_ = fVar272 + fVar160;
                        auVar168._4_4_ = fVar275 + fVar171;
                        auVar168._8_4_ = fVar276 + fVar121;
                        auVar168._12_4_ = fVar277 + fVar136;
                        auVar168._16_4_ = fVar278 + fVar140;
                        auVar168._20_4_ = fVar279 + fVar144;
                        auVar168._24_4_ = fVar280 + fVar174;
                        fVar160 = in_ZMM12._28_4_;
                        auVar168._28_4_ = fVar160 + auVar169._28_4_;
                        local_2c60._4_4_ =
                             fVar141 * (float)local_2ba0._4_4_ + fVar101 * (float)local_2c60._4_4_;
                        local_2c60._0_4_ =
                             fVar139 * (float)local_2ba0._0_4_ + fVar99 * (float)local_2c60._0_4_;
                        fStack_2c58 = fVar143 * fStack_2b98 + fVar98 * fStack_2c58;
                        fStack_2c54 = fVar117 * fStack_2b94 + fVar100 * fStack_2c54;
                        fStack_2c50 = fVar118 * fStack_2b90 + fVar102 * fStack_2c50;
                        fStack_2c4c = fVar119 * fStack_2b8c + fVar84 * fStack_2c4c;
                        fStack_2c48 = fVar120 * fStack_2b88 + fVar137 * fStack_2c48;
                        fStack_2c44 = fVar159 + fVar160;
                        local_2dc0._4_4_ = (float)local_2c20._4_4_ + fVar190;
                        local_2dc0._0_4_ = (float)local_2c20._0_4_ + fVar175;
                        fStack_2db8 = fStack_2c18 + fVar193;
                        fStack_2db4 = fStack_2c14 + fVar196;
                        fStack_2db0 = fStack_2c10 + fVar199;
                        fStack_2dac = fStack_2c0c + fVar202;
                        fStack_2da8 = fStack_2c08 + fVar205;
                        fStack_2da4 = fStack_2c04 + fVar83;
                        local_2d40._4_4_ = (float)local_2b80._4_4_ + fVar191;
                        local_2d40._0_4_ = (float)local_2b80._0_4_ + fVar176;
                        fStack_2d38 = fStack_2b78 + fVar194;
                        fStack_2d34 = fStack_2b74 + fVar197;
                        fStack_2d30 = fStack_2b70 + fVar200;
                        fStack_2d2c = fStack_2b6c + fVar203;
                        fStack_2d28 = fStack_2b68 + fVar206;
                        fStack_2d24 = fStack_2b64 + fVar83;
                        local_2b60._0_4_ = auVar281._0_4_ * fVar139 + auVar282._0_4_ * fVar99;
                        local_2b60._4_4_ = auVar281._4_4_ * fVar141 + auVar282._4_4_ * fVar101;
                        local_2b60._8_4_ = auVar281._8_4_ * fVar143 + auVar282._8_4_ * fVar98;
                        local_2b60._12_4_ = auVar281._12_4_ * fVar117 + auVar282._12_4_ * fVar100;
                        local_2b60._16_4_ = auVar281._16_4_ * fVar118 + auVar282._16_4_ * fVar102;
                        local_2b60._20_4_ = auVar281._20_4_ * fVar119 + auVar282._20_4_ * fVar84;
                        local_2b60._24_4_ = auVar281._24_4_ * fVar120 + auVar282._24_4_ * fVar137;
                        local_2b60._28_4_ = fVar159 + fVar160;
                        auVar271 = ZEXT436((uint)local_2b60._28_4_);
                        local_2940._4_4_ = fVar192 + fVar234;
                        local_2940._0_4_ = fVar177 + fVar225;
                        fStack_2938 = fVar195 + fVar235;
                        fStack_2934 = fVar198 + fVar236;
                        fStack_2930 = fVar201 + fVar237;
                        fStack_292c = fVar204 + fVar238;
                        fStack_2928 = fVar207 + fVar239;
                        fStack_2924 = fVar208 + auVar233._28_4_;
                        fStack_2944 = auVar248._28_4_ + fVar135;
                        local_2960._4_4_ = fVar249 + fVar219;
                        local_2960._0_4_ = fVar240 + fVar209;
                        fStack_2958 = fVar250 + fVar220;
                        fStack_2954 = fVar251 + fVar221;
                        fStack_2950 = fVar252 + fVar222;
                        fStack_294c = fVar253 + fVar223;
                        fStack_2948 = fVar254 + fVar224;
                        local_2640._0_4_ = auVar260._0_4_ * fVar139 + auVar255._0_4_ * fVar99;
                        local_2640._4_4_ = auVar260._4_4_ * fVar141 + auVar255._4_4_ * fVar101;
                        local_2640._8_4_ = auVar260._8_4_ * fVar143 + auVar255._8_4_ * fVar98;
                        local_2640._12_4_ = auVar260._12_4_ * fVar117 + auVar255._12_4_ * fVar100;
                        local_2640._16_4_ = auVar260._16_4_ * fVar118 + auVar255._16_4_ * fVar102;
                        local_2640._20_4_ = auVar260._20_4_ * fVar119 + auVar255._20_4_ * fVar84;
                        local_2640._24_4_ = auVar260._24_4_ * fVar120 + auVar255._24_4_ * fVar137;
                        local_2640._28_4_ = fStack_2944 + auVar233._28_4_;
                        local_2660._0_4_ =
                             fVar139 * (float)local_2b00._0_4_ + fVar99 * (float)local_2cc0;
                        local_2660._4_4_ =
                             fVar141 * (float)local_2b00._4_4_ + fVar101 * local_2cc0._4_4_;
                        local_2660._8_4_ = fVar143 * fStack_2af8 + fVar98 * fStack_2cb8;
                        local_2660._12_4_ = fVar117 * fStack_2af4 + fVar100 * fStack_2cb4;
                        local_2660._16_4_ = fVar118 * fStack_2af0 + fVar102 * fStack_2cb0;
                        local_2660._20_4_ = fVar119 * fStack_2aec + fVar84 * fStack_2cac;
                        local_2660._24_4_ = fVar120 * fStack_2ae8 + fVar137 * fStack_2ca8;
                        local_2660._28_4_ = fVar135 + fStack_2944;
                        local_2680._0_4_ =
                             fVar139 * (float)local_2ae0._0_4_ + fVar99 * local_2ca0[0];
                        local_2680._4_4_ =
                             fVar141 * (float)local_2ae0._4_4_ + fVar101 * local_2ca0[1];
                        local_2680._8_4_ = fVar143 * fStack_2ad8 + fVar98 * local_2ca0[2];
                        local_2680._12_4_ = fVar117 * fStack_2ad4 + fVar100 * local_2ca0[3];
                        local_2680._16_4_ = fVar118 * fStack_2ad0 + fVar102 * fStack_2c90;
                        local_2680._20_4_ = fVar119 * fStack_2acc + fVar84 * fStack_2c8c;
                        local_2680._24_4_ = fVar120 * fStack_2ac8 + fVar137 * fStack_2c88;
                        local_2680._28_4_ = auVar146._28_4_ + auVar110._28_4_;
                        uVar78 = local_2dd8;
                      }
                      auVar146 = *(undefined1 (*) [32])ray;
                      auVar124 = *(undefined1 (*) [32])(ray + 0x20);
                      auVar110 = *(undefined1 (*) [32])(ray + 0x40);
                      _local_2c20 = vsubps_avx(auVar133._0_32_,auVar146);
                      _local_2b80 = vsubps_avx(auVar157,auVar124);
                      _local_2ba0 = vsubps_avx(auVar168,auVar110);
                      auVar145 = vsubps_avx(local_2640,auVar146);
                      auVar162 = vsubps_avx(local_2660,auVar124);
                      auVar211 = vsubps_avx(local_2680,auVar110);
                      local_2980 = vsubps_avx(auVar145,_local_2c20);
                      local_29c0 = vsubps_avx(auVar162,_local_2b80);
                      local_29a0 = vsubps_avx(auVar211,_local_2ba0);
                      auVar107._0_4_ = auVar145._0_4_ + local_2c20._0_4_;
                      auVar107._4_4_ = auVar145._4_4_ + local_2c20._4_4_;
                      auVar107._8_4_ = auVar145._8_4_ + local_2c20._8_4_;
                      auVar107._12_4_ = auVar145._12_4_ + local_2c20._12_4_;
                      auVar107._16_4_ = auVar145._16_4_ + local_2c20._16_4_;
                      auVar107._20_4_ = auVar145._20_4_ + local_2c20._20_4_;
                      auVar107._24_4_ = auVar145._24_4_ + local_2c20._24_4_;
                      auVar107._28_4_ = auVar145._28_4_ + local_2c20._28_4_;
                      auVar165._0_4_ = auVar162._0_4_ + local_2b80._0_4_;
                      auVar165._4_4_ = auVar162._4_4_ + local_2b80._4_4_;
                      auVar165._8_4_ = auVar162._8_4_ + local_2b80._8_4_;
                      auVar165._12_4_ = auVar162._12_4_ + local_2b80._12_4_;
                      auVar165._16_4_ = auVar162._16_4_ + local_2b80._16_4_;
                      auVar165._20_4_ = auVar162._20_4_ + local_2b80._20_4_;
                      auVar165._24_4_ = auVar162._24_4_ + local_2b80._24_4_;
                      fVar83 = local_2b80._28_4_;
                      auVar165._28_4_ = auVar162._28_4_ + fVar83;
                      fVar120 = local_2ba0._0_4_;
                      auVar258._0_4_ = fVar120 + auVar211._0_4_;
                      fVar159 = local_2ba0._4_4_;
                      auVar258._4_4_ = fVar159 + auVar211._4_4_;
                      fVar160 = local_2ba0._8_4_;
                      auVar258._8_4_ = fVar160 + auVar211._8_4_;
                      fVar170 = local_2ba0._12_4_;
                      auVar258._12_4_ = fVar170 + auVar211._12_4_;
                      fVar171 = local_2ba0._16_4_;
                      auVar258._16_4_ = fVar171 + auVar211._16_4_;
                      fVar172 = local_2ba0._20_4_;
                      auVar258._20_4_ = fVar172 + auVar211._20_4_;
                      fVar121 = local_2ba0._24_4_;
                      auVar258._24_4_ = fVar121 + auVar211._24_4_;
                      fVar135 = auVar211._28_4_;
                      auVar258._28_4_ = local_2ba0._28_4_ + fVar135;
                      auVar248._0_4_ = auVar165._0_4_ * local_29a0._0_4_;
                      auVar248._4_4_ = auVar165._4_4_ * local_29a0._4_4_;
                      auVar248._8_4_ = auVar165._8_4_ * local_29a0._8_4_;
                      auVar248._12_4_ = auVar165._12_4_ * local_29a0._12_4_;
                      auVar248._16_4_ = auVar165._16_4_ * local_29a0._16_4_;
                      auVar248._20_4_ = auVar165._20_4_ * local_29a0._20_4_;
                      auVar248._28_36_ = auVar133._28_36_;
                      auVar248._24_4_ = auVar165._24_4_ * local_29a0._24_4_;
                      auVar85 = vfmsub231ps_fma(auVar248._0_32_,local_29c0,auVar258);
                      auVar233._0_4_ = auVar258._0_4_ * local_2980._0_4_;
                      auVar233._4_4_ = auVar258._4_4_ * local_2980._4_4_;
                      auVar233._8_4_ = auVar258._8_4_ * local_2980._8_4_;
                      auVar233._12_4_ = auVar258._12_4_ * local_2980._12_4_;
                      auVar233._16_4_ = auVar258._16_4_ * local_2980._16_4_;
                      auVar233._20_4_ = auVar258._20_4_ * local_2980._20_4_;
                      auVar233._24_4_ = auVar258._24_4_ * local_2980._24_4_;
                      auVar233._28_36_ = auVar271;
                      auVar122 = vfmsub231ps_fma(auVar233._0_32_,local_29a0,auVar107);
                      auVar24._4_4_ = auVar107._4_4_ * local_29c0._4_4_;
                      auVar24._0_4_ = auVar107._0_4_ * local_29c0._0_4_;
                      auVar24._8_4_ = auVar107._8_4_ * local_29c0._8_4_;
                      auVar24._12_4_ = auVar107._12_4_ * local_29c0._12_4_;
                      auVar24._16_4_ = auVar107._16_4_ * local_29c0._16_4_;
                      auVar24._20_4_ = auVar107._20_4_ * local_29c0._20_4_;
                      auVar24._24_4_ = auVar107._24_4_ * local_29c0._24_4_;
                      auVar24._28_4_ = local_29c0._28_4_;
                      auVar11 = vfmsub231ps_fma(auVar24,local_2980,auVar165);
                      pRVar1 = ray + 0xc0;
                      fVar137 = *(float *)pRVar1;
                      fVar139 = *(float *)(ray + 0xc4);
                      fVar141 = *(float *)(ray + 200);
                      fVar143 = *(float *)(ray + 0xcc);
                      fVar117 = *(float *)(ray + 0xd0);
                      fVar118 = *(float *)(ray + 0xd4);
                      fVar119 = *(float *)(ray + 0xd8);
                      auVar255 = *(undefined1 (*) [28])pRVar1;
                      auVar25._4_4_ = fVar139 * auVar11._4_4_;
                      auVar25._0_4_ = fVar137 * auVar11._0_4_;
                      auVar25._8_4_ = fVar141 * auVar11._8_4_;
                      auVar25._12_4_ = fVar143 * auVar11._12_4_;
                      auVar25._16_4_ = fVar117 * 0.0;
                      auVar25._20_4_ = fVar118 * 0.0;
                      auVar25._24_4_ = fVar119 * 0.0;
                      auVar25._28_4_ = local_29a0._28_4_;
                      local_2d60 = *(undefined1 (*) [32])(ray + 0xa0);
                      auVar122 = vfmadd231ps_fma(auVar25,local_2d60,ZEXT1632(auVar122));
                      auVar92 = *(undefined1 (*) [32])(ray + 0x80);
                      in_ZMM11 = ZEXT3264(auVar92);
                      auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar92,ZEXT1632(auVar85));
                      auVar233 = ZEXT1664(auVar122);
                      auVar146 = vsubps_avx(_local_2c60,auVar146);
                      auVar124 = vsubps_avx(_local_2dc0,auVar124);
                      auVar110 = vsubps_avx(_local_2d40,auVar110);
                      auVar153 = vsubps_avx(_local_2b80,auVar124);
                      in_ZMM13 = ZEXT3264(auVar153);
                      auVar95 = vsubps_avx(_local_2ba0,auVar110);
                      in_ZMM15 = ZEXT3264(auVar95);
                      auVar166._0_4_ = local_2b80._0_4_ + auVar124._0_4_;
                      auVar166._4_4_ = local_2b80._4_4_ + auVar124._4_4_;
                      auVar166._8_4_ = local_2b80._8_4_ + auVar124._8_4_;
                      auVar166._12_4_ = local_2b80._12_4_ + auVar124._12_4_;
                      auVar166._16_4_ = local_2b80._16_4_ + auVar124._16_4_;
                      auVar166._20_4_ = local_2b80._20_4_ + auVar124._20_4_;
                      auVar166._24_4_ = local_2b80._24_4_ + auVar124._24_4_;
                      auVar166._28_4_ = fVar83 + auVar124._28_4_;
                      auVar273._0_4_ = fVar120 + auVar110._0_4_;
                      auVar273._4_4_ = fVar159 + auVar110._4_4_;
                      auVar273._8_4_ = fVar160 + auVar110._8_4_;
                      auVar273._12_4_ = fVar170 + auVar110._12_4_;
                      auVar273._16_4_ = fVar171 + auVar110._16_4_;
                      auVar273._20_4_ = fVar172 + auVar110._20_4_;
                      auVar273._24_4_ = fVar121 + auVar110._24_4_;
                      auVar273._28_4_ = local_2ba0._28_4_ + auVar110._28_4_;
                      fVar174 = auVar95._0_4_;
                      fVar264 = auVar95._4_4_;
                      auVar26._4_4_ = fVar264 * auVar166._4_4_;
                      auVar26._0_4_ = fVar174 * auVar166._0_4_;
                      fVar265 = auVar95._8_4_;
                      auVar26._8_4_ = fVar265 * auVar166._8_4_;
                      fVar266 = auVar95._12_4_;
                      auVar26._12_4_ = fVar266 * auVar166._12_4_;
                      fVar267 = auVar95._16_4_;
                      auVar26._16_4_ = fVar267 * auVar166._16_4_;
                      fVar268 = auVar95._20_4_;
                      auVar26._20_4_ = fVar268 * auVar166._20_4_;
                      fVar269 = auVar95._24_4_;
                      auVar26._24_4_ = fVar269 * auVar166._24_4_;
                      auVar26._28_4_ = fVar83;
                      auVar11 = vfmsub231ps_fma(auVar26,auVar153,auVar273);
                      auVar261 = vsubps_avx(_local_2c20,auVar146);
                      in_ZMM14 = ZEXT3264(auVar261);
                      fVar83 = auVar261._0_4_;
                      fVar99 = auVar261._4_4_;
                      auVar27._4_4_ = auVar273._4_4_ * fVar99;
                      auVar27._0_4_ = auVar273._0_4_ * fVar83;
                      fVar101 = auVar261._8_4_;
                      auVar27._8_4_ = auVar273._8_4_ * fVar101;
                      fVar98 = auVar261._12_4_;
                      auVar27._12_4_ = auVar273._12_4_ * fVar98;
                      fVar100 = auVar261._16_4_;
                      auVar27._16_4_ = auVar273._16_4_ * fVar100;
                      fVar102 = auVar261._20_4_;
                      auVar27._20_4_ = auVar273._20_4_ * fVar102;
                      fVar84 = auVar261._24_4_;
                      auVar27._24_4_ = auVar273._24_4_ * fVar84;
                      auVar27._28_4_ = auVar273._28_4_;
                      auVar216._0_4_ = local_2c20._0_4_ + auVar146._0_4_;
                      auVar216._4_4_ = local_2c20._4_4_ + auVar146._4_4_;
                      auVar216._8_4_ = local_2c20._8_4_ + auVar146._8_4_;
                      auVar216._12_4_ = local_2c20._12_4_ + auVar146._12_4_;
                      auVar216._16_4_ = local_2c20._16_4_ + auVar146._16_4_;
                      auVar216._20_4_ = local_2c20._20_4_ + auVar146._20_4_;
                      auVar216._24_4_ = local_2c20._24_4_ + auVar146._24_4_;
                      auVar216._28_4_ = local_2c20._28_4_ + auVar146._28_4_;
                      auVar85 = vfmsub231ps_fma(auVar27,auVar95,auVar216);
                      fVar134 = auVar153._0_4_;
                      fVar136 = auVar153._4_4_;
                      auVar28._4_4_ = fVar136 * auVar216._4_4_;
                      auVar28._0_4_ = fVar134 * auVar216._0_4_;
                      fVar138 = auVar153._8_4_;
                      auVar28._8_4_ = fVar138 * auVar216._8_4_;
                      fVar140 = auVar153._12_4_;
                      auVar28._12_4_ = fVar140 * auVar216._12_4_;
                      fVar142 = auVar153._16_4_;
                      auVar28._16_4_ = fVar142 * auVar216._16_4_;
                      fVar144 = auVar153._20_4_;
                      auVar28._20_4_ = fVar144 * auVar216._20_4_;
                      fVar173 = auVar153._24_4_;
                      auVar28._24_4_ = fVar173 * auVar216._24_4_;
                      auVar28._28_4_ = auVar216._28_4_;
                      auVar12 = vfmsub231ps_fma(auVar28,auVar261,auVar166);
                      auVar29._4_4_ = fVar139 * auVar12._4_4_;
                      auVar29._0_4_ = fVar137 * auVar12._0_4_;
                      auVar29._8_4_ = fVar141 * auVar12._8_4_;
                      auVar29._12_4_ = fVar143 * auVar12._12_4_;
                      auVar29._16_4_ = fVar117 * 0.0;
                      auVar29._20_4_ = fVar118 * 0.0;
                      auVar29._24_4_ = fVar119 * 0.0;
                      auVar29._28_4_ = auVar166._28_4_;
                      auVar85 = vfmadd231ps_fma(auVar29,local_2d60,ZEXT1632(auVar85));
                      auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar92,ZEXT1632(auVar11));
                      auVar169 = ZEXT1664(auVar85);
                      auVar91 = vsubps_avx(auVar146,auVar145);
                      in_ZMM12 = ZEXT3264(auVar91);
                      auVar89._0_4_ = auVar145._0_4_ + auVar146._0_4_;
                      auVar89._4_4_ = auVar145._4_4_ + auVar146._4_4_;
                      auVar89._8_4_ = auVar145._8_4_ + auVar146._8_4_;
                      auVar89._12_4_ = auVar145._12_4_ + auVar146._12_4_;
                      auVar89._16_4_ = auVar145._16_4_ + auVar146._16_4_;
                      auVar89._20_4_ = auVar145._20_4_ + auVar146._20_4_;
                      auVar89._24_4_ = auVar145._24_4_ + auVar146._24_4_;
                      auVar89._28_4_ = auVar145._28_4_ + auVar146._28_4_;
                      auVar103 = vsubps_avx(auVar124,auVar162);
                      auVar126._0_4_ = auVar162._0_4_ + auVar124._0_4_;
                      auVar126._4_4_ = auVar162._4_4_ + auVar124._4_4_;
                      auVar126._8_4_ = auVar162._8_4_ + auVar124._8_4_;
                      auVar126._12_4_ = auVar162._12_4_ + auVar124._12_4_;
                      auVar126._16_4_ = auVar162._16_4_ + auVar124._16_4_;
                      auVar126._20_4_ = auVar162._20_4_ + auVar124._20_4_;
                      auVar126._24_4_ = auVar162._24_4_ + auVar124._24_4_;
                      auVar126._28_4_ = auVar162._28_4_ + auVar124._28_4_;
                      auVar162 = vsubps_avx(auVar110,auVar211);
                      auVar108._0_4_ = auVar110._0_4_ + auVar211._0_4_;
                      auVar108._4_4_ = auVar110._4_4_ + auVar211._4_4_;
                      auVar108._8_4_ = auVar110._8_4_ + auVar211._8_4_;
                      auVar108._12_4_ = auVar110._12_4_ + auVar211._12_4_;
                      auVar108._16_4_ = auVar110._16_4_ + auVar211._16_4_;
                      auVar108._20_4_ = auVar110._20_4_ + auVar211._20_4_;
                      auVar108._24_4_ = auVar110._24_4_ + auVar211._24_4_;
                      auVar108._28_4_ = auVar110._28_4_ + fVar135;
                      auVar30._4_4_ = auVar162._4_4_ * auVar126._4_4_;
                      auVar30._0_4_ = auVar162._0_4_ * auVar126._0_4_;
                      auVar30._8_4_ = auVar162._8_4_ * auVar126._8_4_;
                      auVar30._12_4_ = auVar162._12_4_ * auVar126._12_4_;
                      auVar30._16_4_ = auVar162._16_4_ * auVar126._16_4_;
                      auVar30._20_4_ = auVar162._20_4_ * auVar126._20_4_;
                      auVar30._24_4_ = auVar162._24_4_ * auVar126._24_4_;
                      auVar30._28_4_ = fVar135;
                      auVar12 = vfmsub231ps_fma(auVar30,auVar103,auVar108);
                      auVar31._4_4_ = auVar91._4_4_ * auVar108._4_4_;
                      auVar31._0_4_ = auVar91._0_4_ * auVar108._0_4_;
                      auVar31._8_4_ = auVar91._8_4_ * auVar108._8_4_;
                      auVar31._12_4_ = auVar91._12_4_ * auVar108._12_4_;
                      auVar31._16_4_ = auVar91._16_4_ * auVar108._16_4_;
                      auVar31._20_4_ = auVar91._20_4_ * auVar108._20_4_;
                      auVar31._24_4_ = auVar91._24_4_ * auVar108._24_4_;
                      auVar31._28_4_ = auVar108._28_4_;
                      auVar11 = vfmsub231ps_fma(auVar31,auVar162,auVar89);
                      auVar32._4_4_ = auVar103._4_4_ * auVar89._4_4_;
                      auVar32._0_4_ = auVar103._0_4_ * auVar89._0_4_;
                      auVar32._8_4_ = auVar103._8_4_ * auVar89._8_4_;
                      auVar32._12_4_ = auVar103._12_4_ * auVar89._12_4_;
                      auVar32._16_4_ = auVar103._16_4_ * auVar89._16_4_;
                      auVar32._20_4_ = auVar103._20_4_ * auVar89._20_4_;
                      auVar32._24_4_ = auVar103._24_4_ * auVar89._24_4_;
                      auVar32._28_4_ = auVar89._28_4_;
                      auVar123 = vfmsub231ps_fma(auVar32,auVar91,auVar126);
                      _local_29e0 = *(undefined1 (*) [32])pRVar1;
                      auVar90._0_4_ = fVar137 * auVar123._0_4_;
                      auVar90._4_4_ = fVar139 * auVar123._4_4_;
                      auVar90._8_4_ = fVar141 * auVar123._8_4_;
                      auVar90._12_4_ = fVar143 * auVar123._12_4_;
                      auVar90._16_4_ = fVar117 * 0.0;
                      auVar90._20_4_ = fVar118 * 0.0;
                      auVar90._24_4_ = fVar119 * 0.0;
                      auVar90._28_4_ = 0;
                      auVar11 = vfmadd231ps_fma(auVar90,local_2d60,ZEXT1632(auVar11));
                      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar92,ZEXT1632(auVar12));
                      local_26c0 = ZEXT1632(CONCAT412(auVar11._12_4_ +
                                                      auVar122._12_4_ + auVar85._12_4_,
                                                      CONCAT48(auVar11._8_4_ +
                                                               auVar122._8_4_ + auVar85._8_4_,
                                                               CONCAT44(auVar11._4_4_ +
                                                                        auVar122._4_4_ +
                                                                        auVar85._4_4_,
                                                                        auVar11._0_4_ +
                                                                        auVar122._0_4_ +
                                                                        auVar85._0_4_))));
                      local_26a0 = ZEXT1632(auVar122);
                      auVar146 = vminps_avx(local_26a0,ZEXT1632(auVar85));
                      auVar124 = vminps_avx(auVar146,ZEXT1632(auVar11));
                      auVar146 = vandps_avx(local_26c0,local_2920);
                      auVar218 = ZEXT3264(auVar146);
                      uVar74 = CONCAT44(auVar146._4_4_ * 1.1920929e-07,
                                        auVar146._0_4_ * 1.1920929e-07);
                      fVar135 = auVar146._8_4_ * 1.1920929e-07;
                      auVar33._8_4_ = fVar135;
                      auVar33._0_8_ = uVar74;
                      fVar137 = auVar146._12_4_ * 1.1920929e-07;
                      auVar33._12_4_ = fVar137;
                      fVar139 = auVar146._16_4_ * 1.1920929e-07;
                      auVar33._16_4_ = fVar139;
                      fVar141 = auVar146._20_4_ * 1.1920929e-07;
                      auVar33._20_4_ = fVar141;
                      fVar143 = auVar146._24_4_ * 1.1920929e-07;
                      auVar33._24_4_ = fVar143;
                      auVar33._28_4_ = 0x34000000;
                      auVar133 = ZEXT3264(auVar33);
                      local_2d20._8_4_ = 0x80000000;
                      local_2d20._0_8_ = 0x8000000080000000;
                      local_2d20._12_4_ = 0x80000000;
                      local_2d20._16_4_ = 0x80000000;
                      local_2d20._20_4_ = 0x80000000;
                      local_2d20._24_4_ = 0x80000000;
                      local_2d20._28_4_ = 0x80000000;
                      auVar151._0_8_ = uVar74 ^ 0x8000000080000000;
                      auVar151._8_4_ = -fVar135;
                      auVar151._12_4_ = -fVar137;
                      auVar151._16_4_ = -fVar139;
                      auVar151._20_4_ = -fVar141;
                      auVar151._24_4_ = -fVar143;
                      auVar151._28_4_ = 0xb4000000;
                      auVar124 = vcmpps_avx(auVar124,auVar151,5);
                      auVar145 = vmaxps_avx(local_26a0,ZEXT1632(auVar85));
                      auVar110 = vmaxps_avx(auVar145,ZEXT1632(auVar11));
                      auVar110 = vcmpps_avx(auVar110,auVar33,2);
                      auVar124 = vorps_avx(auVar124,auVar110);
                      auVar110 = local_2c80 & auVar124;
                      if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar110 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar110 >> 0x7f,0) == '\0') &&
                            (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar110 >> 0xbf,0) == '\0') &&
                          (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar110[0x1f]) {
LAB_0054a10b:
                        auVar248 = ZEXT3264(_local_2dc0);
                        auVar259 = ZEXT3264(_local_2d40);
                        auVar146 = local_2c80;
                      }
                      else {
                        local_26e0 = auVar146;
                        auVar34._4_4_ = fVar136 * local_29a0._4_4_;
                        auVar34._0_4_ = fVar134 * local_29a0._0_4_;
                        auVar34._8_4_ = fVar138 * local_29a0._8_4_;
                        auVar34._12_4_ = fVar140 * local_29a0._12_4_;
                        auVar34._16_4_ = fVar142 * local_29a0._16_4_;
                        auVar34._20_4_ = fVar144 * local_29a0._20_4_;
                        auVar34._24_4_ = fVar173 * local_29a0._24_4_;
                        auVar34._28_4_ = local_2c80._28_4_;
                        local_2a00 = auVar124;
                        auVar35._4_4_ = fVar99 * local_29c0._4_4_;
                        auVar35._0_4_ = fVar83 * local_29c0._0_4_;
                        auVar35._8_4_ = fVar101 * local_29c0._8_4_;
                        auVar35._12_4_ = fVar98 * local_29c0._12_4_;
                        auVar35._16_4_ = fVar100 * local_29c0._16_4_;
                        auVar35._20_4_ = fVar102 * local_29c0._20_4_;
                        auVar35._24_4_ = fVar84 * local_29c0._24_4_;
                        auVar35._28_4_ = auVar124._28_4_;
                        auVar11 = vfmsub213ps_fma(local_29c0,auVar95,auVar34);
                        auVar36._4_4_ = auVar103._4_4_ * fVar264;
                        auVar36._0_4_ = auVar103._0_4_ * fVar174;
                        auVar36._8_4_ = auVar103._8_4_ * fVar265;
                        auVar36._12_4_ = auVar103._12_4_ * fVar266;
                        auVar36._16_4_ = auVar103._16_4_ * fVar267;
                        auVar36._20_4_ = auVar103._20_4_ * fVar268;
                        auVar36._24_4_ = auVar103._24_4_ * fVar269;
                        auVar36._28_4_ = 0x34000000;
                        auVar37._4_4_ = fVar99 * auVar162._4_4_;
                        auVar37._0_4_ = fVar83 * auVar162._0_4_;
                        auVar37._8_4_ = fVar101 * auVar162._8_4_;
                        auVar37._12_4_ = fVar98 * auVar162._12_4_;
                        auVar37._16_4_ = fVar100 * auVar162._16_4_;
                        auVar37._20_4_ = fVar102 * auVar162._20_4_;
                        auVar37._24_4_ = fVar84 * auVar162._24_4_;
                        auVar37._28_4_ = auVar145._28_4_;
                        auVar12 = vfmsub213ps_fma(auVar162,auVar153,auVar36);
                        auVar110 = vandps_avx(auVar34,local_2920);
                        auVar145 = vandps_avx(auVar36,local_2920);
                        auVar110 = vcmpps_avx(auVar110,auVar145,1);
                        auVar162 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar11),auVar110);
                        auVar218 = ZEXT3264(auVar162);
                        auVar38._4_4_ = auVar91._4_4_ * fVar136;
                        auVar38._0_4_ = auVar91._0_4_ * fVar134;
                        auVar38._8_4_ = auVar91._8_4_ * fVar138;
                        auVar38._12_4_ = auVar91._12_4_ * fVar140;
                        auVar38._16_4_ = auVar91._16_4_ * fVar142;
                        auVar38._20_4_ = auVar91._20_4_ * fVar144;
                        auVar38._24_4_ = auVar91._24_4_ * fVar173;
                        auVar38._28_4_ = auVar110._28_4_;
                        auVar11 = vfmsub213ps_fma(auVar91,auVar95,auVar37);
                        auVar39._4_4_ = local_2980._4_4_ * fVar264;
                        auVar39._0_4_ = local_2980._0_4_ * fVar174;
                        auVar39._8_4_ = local_2980._8_4_ * fVar265;
                        auVar39._12_4_ = local_2980._12_4_ * fVar266;
                        auVar39._16_4_ = local_2980._16_4_ * fVar267;
                        auVar39._20_4_ = local_2980._20_4_ * fVar268;
                        auVar39._24_4_ = local_2980._24_4_ * fVar269;
                        auVar39._28_4_ = auVar145._28_4_;
                        auVar12 = vfmsub213ps_fma(local_29a0,auVar261,auVar39);
                        auVar233 = ZEXT1664(auVar12);
                        auVar110 = vandps_avx(auVar39,local_2920);
                        auVar145 = vandps_avx(auVar37,local_2920);
                        auVar110 = vcmpps_avx(auVar110,auVar145,1);
                        auVar211 = vblendvps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12),auVar110);
                        in_ZMM12 = ZEXT3264(auVar211);
                        auVar11 = vfmsub213ps_fma(local_2980,auVar153,auVar35);
                        auVar12 = vfmsub213ps_fma(auVar103,auVar261,auVar38);
                        auVar110 = vandps_avx(auVar35,local_2920);
                        auVar145 = vandps_avx(auVar38,local_2920);
                        auVar153 = vcmpps_avx(auVar110,auVar145,1);
                        auVar145 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar11),auVar153);
                        local_29e0._0_4_ = auVar255._0_4_;
                        local_29e0._4_4_ = auVar255._4_4_;
                        fStack_29d8 = auVar255._8_4_;
                        fStack_29d4 = auVar255._12_4_;
                        fStack_29d0 = auVar255._16_4_;
                        fStack_29cc = auVar255._20_4_;
                        fStack_29c8 = auVar255._24_4_;
                        auVar40._4_4_ = auVar145._4_4_ * (float)local_29e0._4_4_;
                        auVar40._0_4_ = auVar145._0_4_ * (float)local_29e0._0_4_;
                        auVar40._8_4_ = auVar145._8_4_ * fStack_29d8;
                        auVar40._12_4_ = auVar145._12_4_ * fStack_29d4;
                        auVar40._16_4_ = auVar145._16_4_ * fStack_29d0;
                        auVar40._20_4_ = auVar145._20_4_ * fStack_29cc;
                        auVar40._24_4_ = auVar145._24_4_ * fStack_29c8;
                        auVar40._28_4_ = auVar153._28_4_;
                        auVar11 = vfmadd213ps_fma(local_2d60,auVar211,auVar40);
                        auVar11 = vfmadd213ps_fma(auVar92,auVar162,ZEXT1632(auVar11));
                        fVar83 = auVar11._0_4_ + auVar11._0_4_;
                        fVar135 = auVar11._4_4_ + auVar11._4_4_;
                        fVar99 = auVar11._8_4_ + auVar11._8_4_;
                        fVar101 = auVar11._12_4_ + auVar11._12_4_;
                        auVar91 = ZEXT1632(CONCAT412(fVar101,CONCAT48(fVar99,CONCAT44(fVar135,fVar83
                                                                                     ))));
                        auVar41._4_4_ = auVar145._4_4_ * fVar159;
                        auVar41._0_4_ = auVar145._0_4_ * fVar120;
                        auVar41._8_4_ = auVar145._8_4_ * fVar160;
                        auVar41._12_4_ = auVar145._12_4_ * fVar170;
                        auVar41._16_4_ = auVar145._16_4_ * fVar171;
                        auVar41._20_4_ = auVar145._20_4_ * fVar172;
                        auVar41._24_4_ = auVar145._24_4_ * fVar121;
                        auVar41._28_4_ = auVar110._28_4_;
                        auVar11 = vfmadd213ps_fma(_local_2b80,auVar211,auVar41);
                        auVar12 = vfmadd213ps_fma(_local_2c20,auVar162,ZEXT1632(auVar11));
                        auVar110 = vrcpps_avx(auVar91);
                        auVar244._8_4_ = 0x3f800000;
                        auVar244._0_8_ = 0x3f8000003f800000;
                        auVar244._12_4_ = 0x3f800000;
                        auVar244._16_4_ = 0x3f800000;
                        auVar244._20_4_ = 0x3f800000;
                        auVar244._24_4_ = 0x3f800000;
                        auVar244._28_4_ = 0x3f800000;
                        auVar11 = vfnmadd213ps_fma(auVar110,auVar91,auVar244);
                        auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar110,auVar110);
                        auVar123._0_4_ = (auVar12._0_4_ + auVar12._0_4_) * auVar11._0_4_;
                        auVar123._4_4_ = (auVar12._4_4_ + auVar12._4_4_) * auVar11._4_4_;
                        auVar123._8_4_ = (auVar12._8_4_ + auVar12._8_4_) * auVar11._8_4_;
                        auVar123._12_4_ = (auVar12._12_4_ + auVar12._12_4_) * auVar11._12_4_;
                        auVar130._28_4_ = auVar110._28_4_;
                        auVar130._0_28_ = ZEXT1628(auVar123);
                        auVar133 = ZEXT3264(auVar130);
                        auVar110 = *(undefined1 (*) [32])(ray + 0x100);
                        in_ZMM13 = ZEXT3264(auVar110);
                        auVar92 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar130,2);
                        auVar153 = vcmpps_avx(auVar130,auVar110,2);
                        auVar92 = vandps_avx(auVar92,auVar153);
                        in_ZMM11 = ZEXT3264(local_2d20);
                        auVar152._0_8_ = CONCAT44(fVar135,fVar83) ^ 0x8000000080000000;
                        auVar152._8_4_ = -fVar99;
                        auVar152._12_4_ = -fVar101;
                        auVar152._16_4_ = 0x80000000;
                        auVar152._20_4_ = 0x80000000;
                        auVar152._24_4_ = 0x80000000;
                        auVar152._28_4_ = 0x80000000;
                        auVar153 = vcmpps_avx(auVar91,auVar152,4);
                        auVar92 = vandps_avx(auVar153,auVar92);
                        auVar124 = vandps_avx(local_2c80,auVar124);
                        auVar92 = vpslld_avx2(auVar92,0x1f);
                        auVar153 = vpsrad_avx2(auVar92,0x1f);
                        auVar92 = auVar124 & auVar153;
                        if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar92 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar92 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar92 >> 0x7f,0) == '\0') &&
                              (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar92 >> 0xbf,0) == '\0') &&
                            (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar92[0x1f]) goto LAB_0054a10b;
                        auVar124 = vandps_avx(auVar153,auVar124);
                        unaff_R15 = (Geometry *)local_2b40._0_8_;
                        uVar10 = *(uint *)(local_2b40._0_8_ + 0x34);
                        auVar93._4_4_ = uVar10;
                        auVar93._0_4_ = uVar10;
                        auVar93._8_4_ = uVar10;
                        auVar93._12_4_ = uVar10;
                        auVar93._16_4_ = uVar10;
                        auVar93._20_4_ = uVar10;
                        auVar93._24_4_ = uVar10;
                        auVar93._28_4_ = uVar10;
                        auVar92 = vpand_avx2(auVar93,*(undefined1 (*) [32])(ray + 0x120));
                        auVar153 = vpcmpeqd_avx2(auVar92,_DAT_01faff00);
                        auVar92 = auVar124 & ~auVar153;
                        if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar92 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar92 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar92 >> 0x7f,0) == '\0') &&
                              (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar92 >> 0xbf,0) == '\0') &&
                            (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar92[0x1f]) goto LAB_0054a10b;
                        auVar124 = vandnps_avx(auVar153,auVar124);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (*(RTCFilterFunctionN *)(local_2b40._0_8_ + 0x48) ==
                            (RTCFilterFunctionN)0x0)) {
                          auVar248 = ZEXT3264(_local_2dc0);
                          auVar259 = ZEXT3264(_local_2d40);
                        }
                        else {
                          auVar233 = ZEXT3264(auVar162);
                          auVar92 = vrcpps_avx(local_26c0);
                          auVar247._8_4_ = 0x3f800000;
                          auVar247._0_8_ = 0x3f8000003f800000;
                          auVar247._12_4_ = 0x3f800000;
                          auVar247._16_4_ = 0x3f800000;
                          auVar247._20_4_ = 0x3f800000;
                          auVar247._24_4_ = 0x3f800000;
                          auVar247._28_4_ = 0x3f800000;
                          auVar11 = vfnmadd213ps_fma(local_26c0,auVar92,auVar247);
                          auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar92,auVar92);
                          auVar218 = ZEXT1664(auVar11);
                          auVar96._8_4_ = 0x219392ef;
                          auVar96._0_8_ = 0x219392ef219392ef;
                          auVar96._12_4_ = 0x219392ef;
                          auVar96._16_4_ = 0x219392ef;
                          auVar96._20_4_ = 0x219392ef;
                          auVar96._24_4_ = 0x219392ef;
                          auVar96._28_4_ = 0x219392ef;
                          auVar92 = vcmpps_avx(auVar146,auVar96,5);
                          auVar92 = vandps_avx(auVar92,ZEXT1632(auVar11));
                          auVar60._4_4_ = auVar92._4_4_ * auVar122._4_4_;
                          auVar60._0_4_ = auVar92._0_4_ * auVar122._0_4_;
                          auVar60._8_4_ = auVar92._8_4_ * auVar122._8_4_;
                          auVar60._12_4_ = auVar92._12_4_ * auVar122._12_4_;
                          auVar60._16_4_ = auVar92._16_4_ * 0.0;
                          auVar60._20_4_ = auVar92._20_4_ * 0.0;
                          auVar60._24_4_ = auVar92._24_4_ * 0.0;
                          auVar60._28_4_ = auVar146._28_4_;
                          auVar146 = vminps_avx(auVar60,auVar247);
                          auVar61._4_4_ = auVar85._4_4_ * auVar92._4_4_;
                          auVar61._0_4_ = auVar85._0_4_ * auVar92._0_4_;
                          auVar61._8_4_ = auVar85._8_4_ * auVar92._8_4_;
                          auVar61._12_4_ = auVar85._12_4_ * auVar92._12_4_;
                          auVar61._16_4_ = auVar92._16_4_ * 0.0;
                          auVar61._20_4_ = auVar92._20_4_ * 0.0;
                          auVar61._24_4_ = auVar92._24_4_ * 0.0;
                          auVar61._28_4_ = auVar92._28_4_;
                          auVar92 = vminps_avx(auVar61,auVar247);
                          auVar153 = vsubps_avx(auVar247,auVar146);
                          auVar91 = vsubps_avx(auVar247,auVar92);
                          auVar70._8_8_ = uStack_26f8;
                          auVar70._0_8_ = local_2700;
                          auVar70._16_8_ = uStack_26f0;
                          auVar70._24_8_ = uStack_26e8;
                          local_2ac0 = vblendvps_avx(auVar146,auVar153,auVar70);
                          local_2aa0 = vblendvps_avx(auVar92,auVar91,auVar70);
                          pRVar8 = context->user;
                          auVar122._4_4_ = (undefined4)local_2bd0;
                          auVar122._0_4_ = (undefined4)local_2bd0;
                          auVar122._8_4_ = (undefined4)local_2bd0;
                          auVar122._12_4_ = (undefined4)local_2bd0;
                          local_2a60._16_4_ = (undefined4)local_2bd0;
                          local_2a60._0_16_ = auVar122;
                          local_2a60._20_4_ = (undefined4)local_2bd0;
                          local_2a60._24_4_ = (undefined4)local_2bd0;
                          local_2a60._28_4_ = (undefined4)local_2bd0;
                          auVar169 = ZEXT3264(local_2a60);
                          local_2b20[0] = (RTCHitN)auVar162[0];
                          local_2b20[1] = (RTCHitN)auVar162[1];
                          local_2b20[2] = (RTCHitN)auVar162[2];
                          local_2b20[3] = (RTCHitN)auVar162[3];
                          local_2b20[4] = (RTCHitN)auVar162[4];
                          local_2b20[5] = (RTCHitN)auVar162[5];
                          local_2b20[6] = (RTCHitN)auVar162[6];
                          local_2b20[7] = (RTCHitN)auVar162[7];
                          local_2b20[8] = (RTCHitN)auVar162[8];
                          local_2b20[9] = (RTCHitN)auVar162[9];
                          local_2b20[10] = (RTCHitN)auVar162[10];
                          local_2b20[0xb] = (RTCHitN)auVar162[0xb];
                          local_2b20[0xc] = (RTCHitN)auVar162[0xc];
                          local_2b20[0xd] = (RTCHitN)auVar162[0xd];
                          local_2b20[0xe] = (RTCHitN)auVar162[0xe];
                          local_2b20[0xf] = (RTCHitN)auVar162[0xf];
                          local_2b20[0x10] = (RTCHitN)auVar162[0x10];
                          local_2b20[0x11] = (RTCHitN)auVar162[0x11];
                          local_2b20[0x12] = (RTCHitN)auVar162[0x12];
                          local_2b20[0x13] = (RTCHitN)auVar162[0x13];
                          local_2b20[0x14] = (RTCHitN)auVar162[0x14];
                          local_2b20[0x15] = (RTCHitN)auVar162[0x15];
                          local_2b20[0x16] = (RTCHitN)auVar162[0x16];
                          local_2b20[0x17] = (RTCHitN)auVar162[0x17];
                          local_2b20[0x18] = (RTCHitN)auVar162[0x18];
                          local_2b20[0x19] = (RTCHitN)auVar162[0x19];
                          local_2b20[0x1a] = (RTCHitN)auVar162[0x1a];
                          local_2b20[0x1b] = (RTCHitN)auVar162[0x1b];
                          local_2b20[0x1c] = (RTCHitN)auVar162[0x1c];
                          local_2b20[0x1d] = (RTCHitN)auVar162[0x1d];
                          local_2b20[0x1e] = (RTCHitN)auVar162[0x1e];
                          local_2b20[0x1f] = (RTCHitN)auVar162[0x1f];
                          _local_2b00 = auVar211;
                          _local_2ae0 = auVar145;
                          local_2a80._4_4_ = iVar71;
                          local_2a80._0_4_ = iVar71;
                          local_2a80._8_4_ = iVar71;
                          local_2a80._12_4_ = iVar71;
                          local_2a80._16_4_ = iVar71;
                          local_2a80._20_4_ = iVar71;
                          local_2a80._24_4_ = iVar71;
                          local_2a80._28_4_ = iVar71;
                          auVar146 = vpcmpeqd_avx2(local_2aa0,local_2aa0);
                          local_2c28[1] = auVar146;
                          *local_2c28 = auVar146;
                          local_2a40 = pRVar8->instID[0];
                          uStack_2a3c = local_2a40;
                          uStack_2a38 = local_2a40;
                          uStack_2a34 = local_2a40;
                          uStack_2a30 = local_2a40;
                          uStack_2a2c = local_2a40;
                          uStack_2a28 = local_2a40;
                          uStack_2a24 = local_2a40;
                          local_2a20 = pRVar8->instPrimID[0];
                          uStack_2a1c = local_2a20;
                          uStack_2a18 = local_2a20;
                          uStack_2a14 = local_2a20;
                          uStack_2a10 = local_2a20;
                          uStack_2a0c = local_2a20;
                          uStack_2a08 = local_2a20;
                          uStack_2a04 = local_2a20;
                          auVar146 = vblendvps_avx(auVar110,auVar130,auVar124);
                          *(undefined1 (*) [32])(ray + 0x100) = auVar146;
                          local_2d00 = auVar124;
                          local_2ce0._0_8_ = local_2d00;
                          local_2ce0._8_8_ = *(void **)(local_2b40._0_8_ + 0x18);
                          local_2ce0._16_8_ = context->user;
                          local_2ce0._24_8_ = ray;
                          local_2cc0 = local_2b20;
                          fStack_2cb8 = 1.12104e-44;
                          if (*(RTCFilterFunctionN *)(local_2b40._0_8_ + 0x48) !=
                              (RTCFilterFunctionN)0x0) {
                            local_2d60._0_8_ = pGVar77;
                            auVar130 = ZEXT1632(auVar123);
                            auVar169 = ZEXT1664(auVar122);
                            auVar218 = ZEXT1664(auVar11);
                            auVar233 = ZEXT1664(auVar162._0_16_);
                            in_ZMM11 = ZEXT1664(local_2d20._0_16_);
                            in_ZMM12 = ZEXT1664(auVar211._0_16_);
                            in_ZMM14 = ZEXT1664(auVar261._0_16_);
                            in_ZMM15 = ZEXT1664(auVar95._0_16_);
                            _local_2c20 = auVar110;
                            (**(RTCFilterFunctionN *)(local_2b40._0_8_ + 0x48))
                                      ((RTCFilterFunctionNArguments *)local_2ce0);
                            in_ZMM13 = ZEXT3264(_local_2c20);
                            pGVar77 = (Geometry *)local_2d60._0_8_;
                            uVar78 = local_2dd8;
                          }
                          auVar124 = vpcmpeqd_avx2(local_2d00,_DAT_01faff00);
                          auVar131 = vpcmpeqd_avx2(auVar130,auVar130);
                          auVar146 = auVar131 & ~auVar124;
                          if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar146 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar146 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar146 >> 0x7f,0) == '\0') &&
                                (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar146 >> 0xbf,0) == '\0') &&
                              (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar146[0x1f]) {
                            auVar124 = auVar124 ^ auVar131;
                            auVar248 = ZEXT3264(_local_2dc0);
                            auVar259 = ZEXT3264(_local_2d40);
                          }
                          else {
                            p_Var9 = context->args->filter;
                            auVar248 = ZEXT3264(_local_2dc0);
                            auVar259 = ZEXT3264(_local_2d40);
                            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                ((((anon_struct_4_6_abad0318_for_Geometry_10 *)
                                  ((long)unaff_R15 + 0x3c))->field_0x2 & 0x40) != 0)))) {
                              local_2d60._0_8_ = pGVar77;
                              _local_2c20 = in_ZMM13._0_32_;
                              auVar169 = ZEXT1664(auVar169._0_16_);
                              auVar218 = ZEXT1664(auVar218._0_16_);
                              auVar233 = ZEXT1664(auVar233._0_16_);
                              in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                              in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                              in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                              (*p_Var9)((RTCFilterFunctionNArguments *)local_2ce0);
                              in_ZMM13 = ZEXT3264(_local_2c20);
                              auVar259 = ZEXT3264(_local_2d40);
                              auVar248 = ZEXT3264(_local_2dc0);
                              pGVar77 = (Geometry *)local_2d60._0_8_;
                              uVar78 = local_2dd8;
                              unaff_R15 = pGVar79;
                            }
                            auVar146 = vpcmpeqd_avx2(local_2d00,_DAT_01faff00);
                            auVar124 = auVar146 ^ _DAT_01fe9960;
                            auVar131._8_4_ = 0xff800000;
                            auVar131._0_8_ = 0xff800000ff800000;
                            auVar131._12_4_ = 0xff800000;
                            auVar131._16_4_ = 0xff800000;
                            auVar131._20_4_ = 0xff800000;
                            auVar131._24_4_ = 0xff800000;
                            auVar131._28_4_ = 0xff800000;
                            auVar146 = vblendvps_avx(auVar131,*(undefined1 (*) [32])
                                                               (local_2ce0._24_8_ + 0x100),auVar146)
                            ;
                            *(undefined1 (*) [32])(local_2ce0._24_8_ + 0x100) = auVar146;
                          }
                          auVar133 = ZEXT3264(auVar131);
                          auVar146 = vblendvps_avx(in_ZMM13._0_32_,*(undefined1 (*) [32])local_2d88,
                                                   auVar124);
                          *(undefined1 (*) [32])local_2d88 = auVar146;
                        }
                        auVar146 = vandnps_avx(auVar124,local_2c80);
                      }
                      auVar189 = ZEXT3264(_local_2c60);
                      auVar150 = local_2d80;
                      if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar146 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar146 >> 0x7f,0) == '\0') &&
                            (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar146 >> 0xbf,0) == '\0') &&
                          (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar146[0x1f]) break;
                      auVar124 = *(undefined1 (*) [32])ray;
                      auVar110 = *(undefined1 (*) [32])(ray + 0x20);
                      auVar92 = *(undefined1 (*) [32])(ray + 0x40);
                      auVar162 = vsubps_avx(local_2b60,auVar124);
                      local_2d60 = vsubps_avx(_local_2940,auVar110);
                      _local_2c20 = vsubps_avx(_local_2960,auVar92);
                      auVar145 = vsubps_avx(local_2640,auVar124);
                      auVar211 = vsubps_avx(local_2660,auVar110);
                      auVar153 = vsubps_avx(local_2680,auVar92);
                      auVar95 = vsubps_avx(_local_2c60,auVar124);
                      auVar110 = vsubps_avx(auVar248._0_32_,auVar110);
                      auVar92 = vsubps_avx(auVar259._0_32_,auVar92);
                      _local_2b80 = vsubps_avx(auVar95,auVar162);
                      local_2980 = vsubps_avx(auVar110,local_2d60);
                      _local_2ba0 = vsubps_avx(auVar92,_local_2c20);
                      auVar245._0_4_ = auVar95._0_4_ + auVar162._0_4_;
                      auVar245._4_4_ = auVar95._4_4_ + auVar162._4_4_;
                      auVar245._8_4_ = auVar95._8_4_ + auVar162._8_4_;
                      auVar245._12_4_ = auVar95._12_4_ + auVar162._12_4_;
                      auVar245._16_4_ = auVar95._16_4_ + auVar162._16_4_;
                      auVar245._20_4_ = auVar95._20_4_ + auVar162._20_4_;
                      auVar245._24_4_ = auVar95._24_4_ + auVar162._24_4_;
                      auVar245._28_4_ = auVar95._28_4_ + auVar162._28_4_;
                      local_2c80 = auVar146;
                      auVar263._0_4_ = local_2d60._0_4_ + auVar110._0_4_;
                      auVar263._4_4_ = local_2d60._4_4_ + auVar110._4_4_;
                      auVar263._8_4_ = local_2d60._8_4_ + auVar110._8_4_;
                      auVar263._12_4_ = local_2d60._12_4_ + auVar110._12_4_;
                      auVar263._16_4_ = local_2d60._16_4_ + auVar110._16_4_;
                      auVar263._20_4_ = local_2d60._20_4_ + auVar110._20_4_;
                      auVar263._24_4_ = local_2d60._24_4_ + auVar110._24_4_;
                      auVar263._28_4_ = local_2d60._28_4_ + auVar110._28_4_;
                      fVar83 = local_2c20._0_4_;
                      auVar274._0_4_ = auVar92._0_4_ + fVar83;
                      fVar135 = local_2c20._4_4_;
                      auVar274._4_4_ = auVar92._4_4_ + fVar135;
                      fVar99 = local_2c20._8_4_;
                      auVar274._8_4_ = auVar92._8_4_ + fVar99;
                      fVar101 = local_2c20._12_4_;
                      auVar274._12_4_ = auVar92._12_4_ + fVar101;
                      fVar98 = local_2c20._16_4_;
                      auVar274._16_4_ = auVar92._16_4_ + fVar98;
                      fVar100 = local_2c20._20_4_;
                      auVar274._20_4_ = auVar92._20_4_ + fVar100;
                      fVar102 = local_2c20._24_4_;
                      auVar274._24_4_ = auVar92._24_4_ + fVar102;
                      auVar274._28_4_ = auVar92._28_4_ + local_2c20._28_4_;
                      auVar259._0_4_ = auVar263._0_4_ * local_2ba0._0_4_;
                      auVar259._4_4_ = auVar263._4_4_ * local_2ba0._4_4_;
                      auVar259._8_4_ = auVar263._8_4_ * local_2ba0._8_4_;
                      auVar259._12_4_ = auVar263._12_4_ * local_2ba0._12_4_;
                      auVar259._16_4_ = auVar263._16_4_ * local_2ba0._16_4_;
                      auVar259._20_4_ = auVar263._20_4_ * local_2ba0._20_4_;
                      auVar259._28_36_ = in_ZMM13._28_36_;
                      auVar259._24_4_ = auVar263._24_4_ * local_2ba0._24_4_;
                      auVar85 = vfmsub231ps_fma(auVar259._0_32_,local_2980,auVar274);
                      auVar42._4_4_ = auVar274._4_4_ * local_2b80._4_4_;
                      auVar42._0_4_ = auVar274._0_4_ * local_2b80._0_4_;
                      auVar42._8_4_ = auVar274._8_4_ * local_2b80._8_4_;
                      auVar42._12_4_ = auVar274._12_4_ * local_2b80._12_4_;
                      auVar42._16_4_ = auVar274._16_4_ * local_2b80._16_4_;
                      auVar42._20_4_ = auVar274._20_4_ * local_2b80._20_4_;
                      auVar42._24_4_ = auVar274._24_4_ * local_2b80._24_4_;
                      auVar42._28_4_ = auVar274._28_4_;
                      auVar122 = vfmsub231ps_fma(auVar42,_local_2ba0,auVar245);
                      auVar43._4_4_ = auVar245._4_4_ * local_2980._4_4_;
                      auVar43._0_4_ = auVar245._0_4_ * local_2980._0_4_;
                      auVar43._8_4_ = auVar245._8_4_ * local_2980._8_4_;
                      auVar43._12_4_ = auVar245._12_4_ * local_2980._12_4_;
                      auVar43._16_4_ = auVar245._16_4_ * local_2980._16_4_;
                      auVar43._20_4_ = auVar245._20_4_ * local_2980._20_4_;
                      auVar43._24_4_ = auVar245._24_4_ * local_2980._24_4_;
                      auVar43._28_4_ = auVar245._28_4_;
                      auVar11 = vfmsub231ps_fma(auVar43,_local_2b80,auVar263);
                      pRVar1 = ray + 0xc0;
                      fVar121 = *(float *)pRVar1;
                      fVar134 = *(float *)(ray + 0xc4);
                      fVar136 = *(float *)(ray + 200);
                      fVar138 = *(float *)(ray + 0xcc);
                      fVar140 = *(float *)(ray + 0xd0);
                      fVar142 = *(float *)(ray + 0xd4);
                      fVar144 = *(float *)(ray + 0xd8);
                      auVar255 = *(undefined1 (*) [28])pRVar1;
                      auVar13 = *(undefined1 (*) [32])pRVar1;
                      auVar44._4_4_ = auVar11._4_4_ * fVar134;
                      auVar44._0_4_ = auVar11._0_4_ * fVar121;
                      auVar44._8_4_ = auVar11._8_4_ * fVar136;
                      auVar44._12_4_ = auVar11._12_4_ * fVar138;
                      auVar44._16_4_ = fVar140 * 0.0;
                      auVar44._20_4_ = fVar142 * 0.0;
                      auVar44._24_4_ = fVar144 * 0.0;
                      auVar44._28_4_ = local_2980._28_4_;
                      _local_2d40 = *(undefined1 (*) [32])(ray + 0xa0);
                      auVar122 = vfmadd231ps_fma(auVar44,_local_2d40,ZEXT1632(auVar122));
                      auVar124 = *(undefined1 (*) [32])(ray + 0x80);
                      in_ZMM12 = ZEXT3264(auVar124);
                      auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar124,ZEXT1632(auVar85));
                      auVar259 = ZEXT1664(auVar122);
                      auVar261 = vsubps_avx(local_2d60,auVar211);
                      in_ZMM13 = ZEXT3264(auVar153);
                      auVar91 = vsubps_avx(_local_2c20,auVar153);
                      in_ZMM15 = ZEXT3264(auVar91);
                      auVar246._0_4_ = local_2d60._0_4_ + auVar211._0_4_;
                      auVar246._4_4_ = local_2d60._4_4_ + auVar211._4_4_;
                      auVar246._8_4_ = local_2d60._8_4_ + auVar211._8_4_;
                      auVar246._12_4_ = local_2d60._12_4_ + auVar211._12_4_;
                      auVar246._16_4_ = local_2d60._16_4_ + auVar211._16_4_;
                      auVar246._20_4_ = local_2d60._20_4_ + auVar211._20_4_;
                      auVar246._24_4_ = local_2d60._24_4_ + auVar211._24_4_;
                      auVar246._28_4_ = local_2d60._28_4_ + auVar211._28_4_;
                      auVar127._0_4_ = auVar153._0_4_ + fVar83;
                      auVar127._4_4_ = auVar153._4_4_ + fVar135;
                      auVar127._8_4_ = auVar153._8_4_ + fVar99;
                      auVar127._12_4_ = auVar153._12_4_ + fVar101;
                      auVar127._16_4_ = auVar153._16_4_ + fVar98;
                      auVar127._20_4_ = auVar153._20_4_ + fVar100;
                      auVar127._24_4_ = auVar153._24_4_ + fVar102;
                      auVar127._28_4_ = auVar153._28_4_ + local_2c20._28_4_;
                      fVar84 = auVar91._0_4_;
                      fVar139 = auVar91._4_4_;
                      auVar45._4_4_ = auVar246._4_4_ * fVar139;
                      auVar45._0_4_ = auVar246._0_4_ * fVar84;
                      fVar143 = auVar91._8_4_;
                      auVar45._8_4_ = auVar246._8_4_ * fVar143;
                      fVar118 = auVar91._12_4_;
                      auVar45._12_4_ = auVar246._12_4_ * fVar118;
                      fVar120 = auVar91._16_4_;
                      auVar45._16_4_ = auVar246._16_4_ * fVar120;
                      fVar160 = auVar91._20_4_;
                      auVar45._20_4_ = auVar246._20_4_ * fVar160;
                      fVar171 = auVar91._24_4_;
                      auVar45._24_4_ = auVar246._24_4_ * fVar171;
                      auVar45._28_4_ = local_2b80._28_4_;
                      auVar11 = vfmsub231ps_fma(auVar45,auVar261,auVar127);
                      auVar103 = vsubps_avx(auVar162,auVar145);
                      in_ZMM14 = ZEXT3264(auVar103);
                      fVar173 = auVar103._0_4_;
                      fVar174 = auVar103._4_4_;
                      auVar46._4_4_ = fVar174 * auVar127._4_4_;
                      auVar46._0_4_ = fVar173 * auVar127._0_4_;
                      fVar264 = auVar103._8_4_;
                      auVar46._8_4_ = fVar264 * auVar127._8_4_;
                      fVar265 = auVar103._12_4_;
                      auVar46._12_4_ = fVar265 * auVar127._12_4_;
                      fVar266 = auVar103._16_4_;
                      auVar46._16_4_ = fVar266 * auVar127._16_4_;
                      fVar267 = auVar103._20_4_;
                      auVar46._20_4_ = fVar267 * auVar127._20_4_;
                      fVar268 = auVar103._24_4_;
                      auVar46._24_4_ = fVar268 * auVar127._24_4_;
                      auVar46._28_4_ = auVar127._28_4_;
                      _local_2c60 = auVar162;
                      auVar231._0_4_ = auVar162._0_4_ + auVar145._0_4_;
                      auVar231._4_4_ = auVar162._4_4_ + auVar145._4_4_;
                      auVar231._8_4_ = auVar162._8_4_ + auVar145._8_4_;
                      auVar231._12_4_ = auVar162._12_4_ + auVar145._12_4_;
                      auVar231._16_4_ = auVar162._16_4_ + auVar145._16_4_;
                      auVar231._20_4_ = auVar162._20_4_ + auVar145._20_4_;
                      auVar231._24_4_ = auVar162._24_4_ + auVar145._24_4_;
                      auVar231._28_4_ = auVar162._28_4_ + auVar145._28_4_;
                      auVar85 = vfmsub231ps_fma(auVar46,auVar91,auVar231);
                      local_29a0 = auVar261;
                      fVar137 = auVar261._0_4_;
                      fVar141 = auVar261._4_4_;
                      auVar47._4_4_ = auVar231._4_4_ * fVar141;
                      auVar47._0_4_ = auVar231._0_4_ * fVar137;
                      fVar117 = auVar261._8_4_;
                      auVar47._8_4_ = auVar231._8_4_ * fVar117;
                      fVar119 = auVar261._12_4_;
                      auVar47._12_4_ = auVar231._12_4_ * fVar119;
                      fVar159 = auVar261._16_4_;
                      auVar47._16_4_ = auVar231._16_4_ * fVar159;
                      fVar170 = auVar261._20_4_;
                      auVar47._20_4_ = auVar231._20_4_ * fVar170;
                      fVar172 = auVar261._24_4_;
                      auVar47._24_4_ = auVar231._24_4_ * fVar172;
                      auVar47._28_4_ = auVar231._28_4_;
                      auVar12 = vfmsub231ps_fma(auVar47,auVar103,auVar246);
                      auVar232._0_4_ = fVar121 * auVar12._0_4_;
                      auVar232._4_4_ = fVar134 * auVar12._4_4_;
                      auVar232._8_4_ = fVar136 * auVar12._8_4_;
                      auVar232._12_4_ = fVar138 * auVar12._12_4_;
                      auVar232._16_4_ = fVar140 * 0.0;
                      auVar232._20_4_ = fVar142 * 0.0;
                      auVar232._24_4_ = fVar144 * 0.0;
                      auVar232._28_4_ = 0;
                      auVar85 = vfmadd231ps_fma(auVar232,_local_2d40,ZEXT1632(auVar85));
                      auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar124,ZEXT1632(auVar11));
                      auVar233 = ZEXT1664(auVar85);
                      auVar156 = vsubps_avx(auVar145,auVar95);
                      auVar248 = ZEXT3264(auVar156);
                      auVar128._0_4_ = auVar145._0_4_ + auVar95._0_4_;
                      auVar128._4_4_ = auVar145._4_4_ + auVar95._4_4_;
                      auVar128._8_4_ = auVar145._8_4_ + auVar95._8_4_;
                      auVar128._12_4_ = auVar145._12_4_ + auVar95._12_4_;
                      auVar128._16_4_ = auVar145._16_4_ + auVar95._16_4_;
                      auVar128._20_4_ = auVar145._20_4_ + auVar95._20_4_;
                      auVar128._24_4_ = auVar145._24_4_ + auVar95._24_4_;
                      auVar128._28_4_ = auVar145._28_4_ + auVar95._28_4_;
                      auVar95 = vsubps_avx(auVar211,auVar110);
                      auVar218 = ZEXT3264(auVar95);
                      auVar109._0_4_ = auVar211._0_4_ + auVar110._0_4_;
                      auVar109._4_4_ = auVar211._4_4_ + auVar110._4_4_;
                      auVar109._8_4_ = auVar211._8_4_ + auVar110._8_4_;
                      auVar109._12_4_ = auVar211._12_4_ + auVar110._12_4_;
                      auVar109._16_4_ = auVar211._16_4_ + auVar110._16_4_;
                      auVar109._20_4_ = auVar211._20_4_ + auVar110._20_4_;
                      auVar109._24_4_ = auVar211._24_4_ + auVar110._24_4_;
                      auVar109._28_4_ = auVar211._28_4_ + auVar110._28_4_;
                      auVar211 = vsubps_avx(auVar153,auVar92);
                      in_ZMM11 = ZEXT3264(auVar211);
                      auVar94._0_4_ = auVar153._0_4_ + auVar92._0_4_;
                      auVar94._4_4_ = auVar153._4_4_ + auVar92._4_4_;
                      auVar94._8_4_ = auVar153._8_4_ + auVar92._8_4_;
                      auVar94._12_4_ = auVar153._12_4_ + auVar92._12_4_;
                      auVar94._16_4_ = auVar153._16_4_ + auVar92._16_4_;
                      auVar94._20_4_ = auVar153._20_4_ + auVar92._20_4_;
                      auVar94._24_4_ = auVar153._24_4_ + auVar92._24_4_;
                      auVar94._28_4_ = auVar153._28_4_ + auVar92._28_4_;
                      auVar154._0_4_ = auVar211._0_4_ * auVar109._0_4_;
                      auVar154._4_4_ = auVar211._4_4_ * auVar109._4_4_;
                      auVar154._8_4_ = auVar211._8_4_ * auVar109._8_4_;
                      auVar154._12_4_ = auVar211._12_4_ * auVar109._12_4_;
                      auVar154._16_4_ = auVar211._16_4_ * auVar109._16_4_;
                      auVar154._20_4_ = auVar211._20_4_ * auVar109._20_4_;
                      auVar154._24_4_ = auVar211._24_4_ * auVar109._24_4_;
                      auVar154._28_4_ = 0;
                      auVar12 = vfmsub231ps_fma(auVar154,auVar95,auVar94);
                      auVar48._4_4_ = auVar156._4_4_ * auVar94._4_4_;
                      auVar48._0_4_ = auVar156._0_4_ * auVar94._0_4_;
                      auVar48._8_4_ = auVar156._8_4_ * auVar94._8_4_;
                      auVar48._12_4_ = auVar156._12_4_ * auVar94._12_4_;
                      auVar48._16_4_ = auVar156._16_4_ * auVar94._16_4_;
                      auVar48._20_4_ = auVar156._20_4_ * auVar94._20_4_;
                      auVar48._24_4_ = auVar156._24_4_ * auVar94._24_4_;
                      auVar48._28_4_ = auVar94._28_4_;
                      auVar11 = vfmsub231ps_fma(auVar48,auVar211,auVar128);
                      auVar49._4_4_ = auVar128._4_4_ * auVar95._4_4_;
                      auVar49._0_4_ = auVar128._0_4_ * auVar95._0_4_;
                      auVar49._8_4_ = auVar128._8_4_ * auVar95._8_4_;
                      auVar49._12_4_ = auVar128._12_4_ * auVar95._12_4_;
                      auVar49._16_4_ = auVar128._16_4_ * auVar95._16_4_;
                      auVar49._20_4_ = auVar128._20_4_ * auVar95._20_4_;
                      auVar49._24_4_ = auVar128._24_4_ * auVar95._24_4_;
                      auVar49._28_4_ = auVar128._28_4_;
                      auVar123 = vfmsub231ps_fma(auVar49,auVar156,auVar109);
                      auVar50._4_4_ = fVar134 * auVar123._4_4_;
                      auVar50._0_4_ = fVar121 * auVar123._0_4_;
                      auVar50._8_4_ = fVar136 * auVar123._8_4_;
                      auVar50._12_4_ = fVar138 * auVar123._12_4_;
                      auVar50._16_4_ = fVar140 * 0.0;
                      auVar50._20_4_ = fVar142 * 0.0;
                      auVar50._24_4_ = fVar144 * 0.0;
                      auVar50._28_4_ = auVar109._28_4_;
                      auVar11 = vfmadd231ps_fma(auVar50,_local_2d40,ZEXT1632(auVar11));
                      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar124,ZEXT1632(auVar12));
                      auVar188 = ZEXT1632(CONCAT412(auVar11._12_4_ +
                                                    auVar122._12_4_ + auVar85._12_4_,
                                                    CONCAT48(auVar11._8_4_ +
                                                             auVar122._8_4_ + auVar85._8_4_,
                                                             CONCAT44(auVar11._4_4_ +
                                                                      auVar122._4_4_ + auVar85._4_4_
                                                                      ,auVar11._0_4_ +
                                                                       auVar122._0_4_ +
                                                                       auVar85._0_4_))));
                      auVar189 = ZEXT3264(auVar188);
                      _local_29e0 = ZEXT1632(auVar122);
                      auVar110 = vminps_avx(_local_29e0,ZEXT1632(auVar85));
                      auVar110 = vminps_avx(auVar110,ZEXT1632(auVar11));
                      auVar169 = ZEXT3264(local_2920);
                      local_2b40 = vandps_avx(auVar188,local_2920);
                      fVar121 = local_2b40._0_4_ * 1.1920929e-07;
                      fVar134 = local_2b40._4_4_ * 1.1920929e-07;
                      auVar51._4_4_ = fVar134;
                      auVar51._0_4_ = fVar121;
                      fVar136 = local_2b40._8_4_ * 1.1920929e-07;
                      auVar51._8_4_ = fVar136;
                      fVar138 = local_2b40._12_4_ * 1.1920929e-07;
                      auVar51._12_4_ = fVar138;
                      fVar140 = local_2b40._16_4_ * 1.1920929e-07;
                      auVar51._16_4_ = fVar140;
                      fVar142 = local_2b40._20_4_ * 1.1920929e-07;
                      auVar51._20_4_ = fVar142;
                      fVar144 = local_2b40._24_4_ * 1.1920929e-07;
                      auVar51._24_4_ = fVar144;
                      auVar51._28_4_ = 0x34000000;
                      auVar133 = ZEXT3264(auVar51);
                      auVar155._0_4_ = (uint)fVar121 ^ local_2d20._0_4_;
                      auVar155._4_4_ = (uint)fVar134 ^ local_2d20._4_4_;
                      auVar155._8_4_ = (uint)fVar136 ^ local_2d20._8_4_;
                      auVar155._12_4_ = (uint)fVar138 ^ local_2d20._12_4_;
                      auVar155._16_4_ = (uint)fVar140 ^ local_2d20._16_4_;
                      auVar155._20_4_ = (uint)fVar142 ^ local_2d20._20_4_;
                      auVar155._24_4_ = (uint)fVar144 ^ local_2d20._24_4_;
                      auVar155._28_4_ = local_2d20._28_4_ ^ 0x34000000;
                      auVar110 = vcmpps_avx(auVar110,auVar155,5);
                      auVar145 = vmaxps_avx(_local_29e0,ZEXT1632(auVar85));
                      auVar92 = vmaxps_avx(auVar145,ZEXT1632(auVar11));
                      auVar92 = vcmpps_avx(auVar92,auVar51,2);
                      auVar110 = vorps_avx(auVar110,auVar92);
                      auVar153 = auVar146 & auVar110;
                      bVar82 = true;
                      _local_2dc0 = auVar13;
                      if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar153 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar153 >> 0x7f,0) == '\0') &&
                            (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar153 >> 0xbf,0) == '\0') &&
                          (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar153[0x1f]) {
                        auVar116 = ZEXT3264(local_2d80);
                        auVar158 = ZEXT3264(auVar146);
                      }
                      else {
                        local_2b60 = auVar188;
                        local_2a00 = ZEXT1632(auVar85);
                        local_29c0 = auVar110;
                        in_ZMM13 = ZEXT3264(auVar261);
                        auVar52._4_4_ = fVar141 * local_2ba0._4_4_;
                        auVar52._0_4_ = fVar137 * local_2ba0._0_4_;
                        auVar52._8_4_ = fVar117 * local_2ba0._8_4_;
                        auVar52._12_4_ = fVar119 * local_2ba0._12_4_;
                        auVar52._16_4_ = fVar159 * local_2ba0._16_4_;
                        auVar52._20_4_ = fVar170 * local_2ba0._20_4_;
                        auVar52._24_4_ = fVar172 * local_2ba0._24_4_;
                        auVar52._28_4_ = auVar110._28_4_;
                        auVar53._4_4_ = fVar174 * local_2980._4_4_;
                        auVar53._0_4_ = fVar173 * local_2980._0_4_;
                        auVar53._8_4_ = fVar264 * local_2980._8_4_;
                        auVar53._12_4_ = fVar265 * local_2980._12_4_;
                        auVar53._16_4_ = fVar266 * local_2980._16_4_;
                        auVar53._20_4_ = fVar267 * local_2980._20_4_;
                        auVar53._24_4_ = fVar268 * local_2980._24_4_;
                        auVar53._28_4_ = auVar92._28_4_;
                        auVar11 = vfmsub213ps_fma(local_2980,auVar91,auVar52);
                        auVar54._4_4_ = fVar139 * auVar95._4_4_;
                        auVar54._0_4_ = fVar84 * auVar95._0_4_;
                        auVar54._8_4_ = fVar143 * auVar95._8_4_;
                        auVar54._12_4_ = fVar118 * auVar95._12_4_;
                        auVar54._16_4_ = fVar120 * auVar95._16_4_;
                        auVar54._20_4_ = fVar160 * auVar95._20_4_;
                        auVar54._24_4_ = fVar171 * auVar95._24_4_;
                        auVar54._28_4_ = 0x34000000;
                        auVar55._4_4_ = fVar174 * auVar211._4_4_;
                        auVar55._0_4_ = fVar173 * auVar211._0_4_;
                        auVar55._8_4_ = fVar264 * auVar211._8_4_;
                        auVar55._12_4_ = fVar265 * auVar211._12_4_;
                        auVar55._16_4_ = fVar266 * auVar211._16_4_;
                        auVar55._20_4_ = fVar267 * auVar211._20_4_;
                        auVar55._24_4_ = fVar268 * auVar211._24_4_;
                        auVar55._28_4_ = auVar145._28_4_;
                        auVar12 = vfmsub213ps_fma(auVar211,auVar261,auVar54);
                        auVar92 = vandps_avx(auVar52,local_2920);
                        auVar145 = vandps_avx(auVar54,local_2920);
                        auVar92 = vcmpps_avx(auVar92,auVar145,1);
                        auVar211 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar11),auVar92);
                        auVar259 = ZEXT3264(auVar211);
                        auVar56._4_4_ = auVar156._4_4_ * fVar141;
                        auVar56._0_4_ = auVar156._0_4_ * fVar137;
                        auVar56._8_4_ = auVar156._8_4_ * fVar117;
                        auVar56._12_4_ = auVar156._12_4_ * fVar119;
                        auVar56._16_4_ = auVar156._16_4_ * fVar159;
                        auVar56._20_4_ = auVar156._20_4_ * fVar170;
                        auVar56._24_4_ = auVar156._24_4_ * fVar172;
                        auVar56._28_4_ = auVar92._28_4_;
                        auVar11 = vfmsub213ps_fma(auVar156,auVar91,auVar55);
                        auVar248 = ZEXT1664(auVar11);
                        auVar57._4_4_ = fVar139 * local_2b80._4_4_;
                        auVar57._0_4_ = fVar84 * local_2b80._0_4_;
                        auVar57._8_4_ = fVar143 * local_2b80._8_4_;
                        auVar57._12_4_ = fVar118 * local_2b80._12_4_;
                        auVar57._16_4_ = fVar120 * local_2b80._16_4_;
                        auVar57._20_4_ = fVar160 * local_2b80._20_4_;
                        auVar57._24_4_ = fVar171 * local_2b80._24_4_;
                        auVar57._28_4_ = auVar145._28_4_;
                        auVar12 = vfmsub213ps_fma(_local_2ba0,auVar103,auVar57);
                        auVar92 = vandps_avx(auVar57,local_2920);
                        auVar145 = vandps_avx(auVar55,local_2920);
                        auVar92 = vcmpps_avx(auVar92,auVar145,1);
                        auVar153 = vblendvps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12),auVar92);
                        auVar233 = ZEXT3264(auVar153);
                        auVar11 = vfmsub213ps_fma(_local_2b80,auVar261,auVar53);
                        auVar12 = vfmsub213ps_fma(auVar95,auVar103,auVar56);
                        auVar218 = ZEXT1664(auVar12);
                        auVar92 = vandps_avx(auVar53,local_2920);
                        auVar145 = vandps_avx(auVar56,local_2920);
                        auVar95 = vcmpps_avx(auVar92,auVar145,1);
                        auVar145 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar11),auVar95);
                        auVar189 = ZEXT3264(auVar145);
                        local_2dc0._0_4_ = auVar255._0_4_;
                        local_2dc0._4_4_ = auVar255._4_4_;
                        fStack_2db8 = auVar255._8_4_;
                        fStack_2db4 = auVar255._12_4_;
                        fStack_2db0 = auVar255._16_4_;
                        fStack_2dac = auVar255._20_4_;
                        fStack_2da8 = auVar255._24_4_;
                        auVar58._4_4_ = auVar145._4_4_ * (float)local_2dc0._4_4_;
                        auVar58._0_4_ = auVar145._0_4_ * (float)local_2dc0._0_4_;
                        auVar58._8_4_ = auVar145._8_4_ * fStack_2db8;
                        auVar58._12_4_ = auVar145._12_4_ * fStack_2db4;
                        auVar58._16_4_ = auVar145._16_4_ * fStack_2db0;
                        auVar58._20_4_ = auVar145._20_4_ * fStack_2dac;
                        auVar58._24_4_ = auVar145._24_4_ * fStack_2da8;
                        auVar58._28_4_ = auVar95._28_4_;
                        auVar11 = vfmadd213ps_fma(_local_2d40,auVar153,auVar58);
                        auVar12 = vfmadd213ps_fma(auVar124,auVar211,ZEXT1632(auVar11));
                        in_ZMM12 = ZEXT1664(auVar12);
                        fVar84 = auVar12._0_4_ + auVar12._0_4_;
                        fVar137 = auVar12._4_4_ + auVar12._4_4_;
                        fVar139 = auVar12._8_4_ + auVar12._8_4_;
                        fVar141 = auVar12._12_4_ + auVar12._12_4_;
                        auVar95 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar139,CONCAT44(fVar137,
                                                  fVar84))));
                        auVar59._4_4_ = auVar145._4_4_ * fVar135;
                        auVar59._0_4_ = auVar145._0_4_ * fVar83;
                        auVar59._8_4_ = auVar145._8_4_ * fVar99;
                        auVar59._12_4_ = auVar145._12_4_ * fVar101;
                        auVar59._16_4_ = auVar145._16_4_ * fVar98;
                        auVar59._20_4_ = auVar145._20_4_ * fVar100;
                        auVar59._24_4_ = auVar145._24_4_ * fVar102;
                        auVar59._28_4_ = auVar92._28_4_;
                        auVar11 = vfmadd213ps_fma(local_2d60,auVar153,auVar59);
                        auVar123 = vfmadd213ps_fma(auVar162,auVar211,ZEXT1632(auVar11));
                        auVar124 = vrcpps_avx(auVar95);
                        auVar167._8_4_ = 0x3f800000;
                        auVar167._0_8_ = 0x3f8000003f800000;
                        auVar167._12_4_ = 0x3f800000;
                        auVar167._16_4_ = 0x3f800000;
                        auVar167._20_4_ = 0x3f800000;
                        auVar167._24_4_ = 0x3f800000;
                        auVar167._28_4_ = 0x3f800000;
                        auVar169 = ZEXT3264(auVar167);
                        auVar11 = vfnmadd213ps_fma(auVar124,auVar95,auVar167);
                        auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar124,auVar124);
                        auVar156 = ZEXT1632(CONCAT412((auVar123._12_4_ + auVar123._12_4_) *
                                                      auVar11._12_4_,
                                                      CONCAT48((auVar123._8_4_ + auVar123._8_4_) *
                                                               auVar11._8_4_,
                                                               CONCAT44((auVar123._4_4_ +
                                                                        auVar123._4_4_) *
                                                                        auVar11._4_4_,
                                                                        (auVar123._0_4_ +
                                                                        auVar123._0_4_) *
                                                                        auVar11._0_4_))));
                        auVar124 = *(undefined1 (*) [32])(ray + 0x100);
                        in_ZMM11 = ZEXT3264(auVar124);
                        auVar92 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar156,2);
                        auVar162 = vcmpps_avx(auVar156,auVar124,2);
                        auVar92 = vandps_avx(auVar92,auVar162);
                        auVar129._0_4_ = (uint)fVar84 ^ local_2d20._0_4_;
                        auVar129._4_4_ = (uint)fVar137 ^ local_2d20._4_4_;
                        auVar129._8_4_ = (uint)fVar139 ^ local_2d20._8_4_;
                        auVar129._12_4_ = (uint)fVar141 ^ local_2d20._12_4_;
                        auVar129._16_4_ = local_2d20._16_4_;
                        auVar129._20_4_ = local_2d20._20_4_;
                        auVar129._24_4_ = local_2d20._24_4_;
                        auVar129._28_4_ = local_2d20._28_4_;
                        auVar133 = ZEXT3264(auVar129);
                        auVar162 = vcmpps_avx(auVar95,auVar129,4);
                        auVar92 = vandps_avx(auVar162,auVar92);
                        auVar158 = ZEXT3264(auVar146);
                        auVar146 = vandps_avx(auVar146,auVar110);
                        auVar110 = vpslld_avx2(auVar92,0x1f);
                        auVar92 = vpsrad_avx2(auVar110,0x1f);
                        auVar110 = auVar146 & auVar92;
                        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar110 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar110 >> 0x7f,0) != '\0')
                              || (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar110 >> 0xbf,0) != '\0') ||
                            (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar110[0x1f] < '\0') {
                          auVar146 = vandps_avx(auVar92,auVar146);
                          uVar72 = *(uint *)((long)&pGVar77->intersectionFilterN + (long)pGVar79 * 4
                                            );
                          unaff_R15 = (context->scene->geometries).items[uVar72].ptr;
                          uVar10 = unaff_R15->mask;
                          auVar111._4_4_ = uVar10;
                          auVar111._0_4_ = uVar10;
                          auVar111._8_4_ = uVar10;
                          auVar111._12_4_ = uVar10;
                          auVar111._16_4_ = uVar10;
                          auVar111._20_4_ = uVar10;
                          auVar111._24_4_ = uVar10;
                          auVar111._28_4_ = uVar10;
                          auVar110 = vpand_avx2(auVar111,*(undefined1 (*) [32])(ray + 0x120));
                          auVar92 = vpcmpeqd_avx2(auVar110,_DAT_01faff00);
                          auVar110 = auVar146 & ~auVar92;
                          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar110 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar110 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar110 >> 0x7f,0) != '\0') ||
                                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar110 >> 0xbf,0) != '\0') ||
                              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar110[0x1f] < '\0') {
                            uVar81 = *(undefined4 *)
                                      ((long)&pGVar77->pointQueryFunc + (long)pGVar79 * 4);
                            auVar146 = vandnps_avx(auVar92,auVar146);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (unaff_R15->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                              auVar116 = ZEXT3264(local_2d80);
                            }
                            else {
                              auVar110 = vrcpps_avx(auVar188);
                              auVar217._8_4_ = 0x3f800000;
                              auVar217._0_8_ = 0x3f8000003f800000;
                              auVar217._12_4_ = 0x3f800000;
                              auVar217._16_4_ = 0x3f800000;
                              auVar217._20_4_ = 0x3f800000;
                              auVar217._24_4_ = 0x3f800000;
                              auVar217._28_4_ = 0x3f800000;
                              auVar11 = vfnmadd213ps_fma(auVar188,auVar110,auVar217);
                              auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar110,auVar110);
                              auVar97._8_4_ = 0x219392ef;
                              auVar97._0_8_ = 0x219392ef219392ef;
                              auVar97._12_4_ = 0x219392ef;
                              auVar97._16_4_ = 0x219392ef;
                              auVar97._20_4_ = 0x219392ef;
                              auVar97._24_4_ = 0x219392ef;
                              auVar97._28_4_ = 0x219392ef;
                              auVar110 = vcmpps_avx(local_2b40,auVar97,5);
                              auVar110 = vandps_avx(auVar110,ZEXT1632(auVar11));
                              auVar62._4_4_ = auVar110._4_4_ * auVar122._4_4_;
                              auVar62._0_4_ = auVar110._0_4_ * auVar122._0_4_;
                              auVar62._8_4_ = auVar110._8_4_ * auVar122._8_4_;
                              auVar62._12_4_ = auVar110._12_4_ * auVar122._12_4_;
                              auVar62._16_4_ = auVar110._16_4_ * 0.0;
                              auVar62._20_4_ = auVar110._20_4_ * 0.0;
                              auVar62._24_4_ = auVar110._24_4_ * 0.0;
                              auVar62._28_4_ = local_2b40._28_4_;
                              auVar92 = vminps_avx(auVar62,auVar217);
                              auVar63._4_4_ = auVar110._4_4_ * auVar85._4_4_;
                              auVar63._0_4_ = auVar110._0_4_ * auVar85._0_4_;
                              auVar63._8_4_ = auVar110._8_4_ * auVar85._8_4_;
                              auVar63._12_4_ = auVar110._12_4_ * auVar85._12_4_;
                              auVar63._16_4_ = auVar110._16_4_ * 0.0;
                              auVar63._20_4_ = auVar110._20_4_ * 0.0;
                              auVar63._24_4_ = auVar110._24_4_ * 0.0;
                              auVar63._28_4_ = auVar110._28_4_;
                              auVar110 = vminps_avx(auVar63,auVar217);
                              auVar162 = vsubps_avx(auVar217,auVar92);
                              auVar95 = vsubps_avx(auVar217,auVar110);
                              auVar11._8_8_ = uStack_2718;
                              auVar11._0_8_ = local_2720;
                              auVar69._16_8_ = uStack_2710;
                              auVar69._0_16_ = auVar11;
                              auVar69._24_8_ = uStack_2708;
                              auVar248 = ZEXT3264(auVar69);
                              local_2ac0 = vblendvps_avx(auVar92,auVar162,auVar69);
                              local_2aa0 = vblendvps_avx(auVar110,auVar95,auVar69);
                              pRVar8 = context->user;
                              auVar161._4_4_ = uVar72;
                              auVar161._0_4_ = uVar72;
                              auVar161._8_4_ = uVar72;
                              auVar161._12_4_ = uVar72;
                              local_2a60._16_4_ = uVar72;
                              local_2a60._0_16_ = auVar161;
                              local_2a60._20_4_ = uVar72;
                              local_2a60._24_4_ = uVar72;
                              local_2a60._28_4_ = uVar72;
                              auVar169 = ZEXT3264(local_2a60);
                              auVar210._4_4_ = uVar81;
                              auVar210._0_4_ = uVar81;
                              auVar210._8_4_ = uVar81;
                              auVar210._12_4_ = uVar81;
                              local_2a80._16_4_ = uVar81;
                              local_2a80._0_16_ = auVar210;
                              local_2a80._20_4_ = uVar81;
                              local_2a80._24_4_ = uVar81;
                              local_2a80._28_4_ = uVar81;
                              auVar218 = ZEXT3264(local_2a80);
                              local_2b20[0] = (RTCHitN)auVar211[0];
                              local_2b20[1] = (RTCHitN)auVar211[1];
                              local_2b20[2] = (RTCHitN)auVar211[2];
                              local_2b20[3] = (RTCHitN)auVar211[3];
                              local_2b20[4] = (RTCHitN)auVar211[4];
                              local_2b20[5] = (RTCHitN)auVar211[5];
                              local_2b20[6] = (RTCHitN)auVar211[6];
                              local_2b20[7] = (RTCHitN)auVar211[7];
                              local_2b20[8] = (RTCHitN)auVar211[8];
                              local_2b20[9] = (RTCHitN)auVar211[9];
                              local_2b20[10] = (RTCHitN)auVar211[10];
                              local_2b20[0xb] = (RTCHitN)auVar211[0xb];
                              local_2b20[0xc] = (RTCHitN)auVar211[0xc];
                              local_2b20[0xd] = (RTCHitN)auVar211[0xd];
                              local_2b20[0xe] = (RTCHitN)auVar211[0xe];
                              local_2b20[0xf] = (RTCHitN)auVar211[0xf];
                              local_2b20[0x10] = (RTCHitN)auVar211[0x10];
                              local_2b20[0x11] = (RTCHitN)auVar211[0x11];
                              local_2b20[0x12] = (RTCHitN)auVar211[0x12];
                              local_2b20[0x13] = (RTCHitN)auVar211[0x13];
                              local_2b20[0x14] = (RTCHitN)auVar211[0x14];
                              local_2b20[0x15] = (RTCHitN)auVar211[0x15];
                              local_2b20[0x16] = (RTCHitN)auVar211[0x16];
                              local_2b20[0x17] = (RTCHitN)auVar211[0x17];
                              local_2b20[0x18] = (RTCHitN)auVar211[0x18];
                              local_2b20[0x19] = (RTCHitN)auVar211[0x19];
                              local_2b20[0x1a] = (RTCHitN)auVar211[0x1a];
                              local_2b20[0x1b] = (RTCHitN)auVar211[0x1b];
                              local_2b20[0x1c] = (RTCHitN)auVar211[0x1c];
                              local_2b20[0x1d] = (RTCHitN)auVar211[0x1d];
                              local_2b20[0x1e] = (RTCHitN)auVar211[0x1e];
                              local_2b20[0x1f] = (RTCHitN)auVar211[0x1f];
                              _local_2b00 = auVar153;
                              _local_2ae0 = auVar145;
                              auVar92 = vpcmpeqd_avx2(local_2ac0,local_2ac0);
                              local_2c28[1] = auVar92;
                              *local_2c28 = auVar92;
                              local_2a40 = pRVar8->instID[0];
                              uStack_2a3c = local_2a40;
                              uStack_2a38 = local_2a40;
                              uStack_2a34 = local_2a40;
                              uStack_2a30 = local_2a40;
                              uStack_2a2c = local_2a40;
                              uStack_2a28 = local_2a40;
                              uStack_2a24 = local_2a40;
                              local_2a20 = pRVar8->instPrimID[0];
                              uStack_2a1c = local_2a20;
                              uStack_2a18 = local_2a20;
                              uStack_2a14 = local_2a20;
                              uStack_2a10 = local_2a20;
                              uStack_2a0c = local_2a20;
                              uStack_2a08 = local_2a20;
                              uStack_2a04 = local_2a20;
                              auVar110 = vblendvps_avx(auVar124,auVar156,auVar146);
                              *(undefined1 (*) [32])(ray + 0x100) = auVar110;
                              local_2d00 = auVar146;
                              local_2ce0._0_8_ = local_2d00;
                              local_2ce0._8_8_ = unaff_R15->userPtr;
                              local_2ce0._16_8_ = context->user;
                              local_2ce0._24_8_ = ray;
                              local_2cc0 = local_2b20;
                              fStack_2cb8 = 1.12104e-44;
                              if (unaff_R15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                local_2d60._0_8_ = pGVar77;
                                auVar169 = ZEXT1664(auVar161);
                                auVar189 = ZEXT1664(auVar145._0_16_);
                                auVar218 = ZEXT1664(auVar210);
                                auVar233 = ZEXT1664(auVar153._0_16_);
                                auVar248 = ZEXT1664(auVar11);
                                auVar259 = ZEXT1664(auVar211._0_16_);
                                in_ZMM12 = ZEXT1664(auVar12);
                                in_ZMM13 = ZEXT1664(auVar261._0_16_);
                                in_ZMM14 = ZEXT1664(auVar103._0_16_);
                                in_ZMM15 = ZEXT1664(auVar91._0_16_);
                                local_2d20 = auVar124;
                                (*unaff_R15->occlusionFilterN)
                                          ((RTCFilterFunctionNArguments *)local_2ce0);
                                auVar116._8_56_ = extraout_var;
                                auVar116._0_8_ = extraout_XMM1_Qa;
                                in_ZMM11 = ZEXT3264(local_2d20);
                                auVar92 = vpcmpeqd_avx2(auVar116._0_32_,auVar116._0_32_);
                                pGVar77 = (Geometry *)local_2d60._0_8_;
                                uVar78 = local_2dd8;
                              }
                              auVar146 = vpcmpeqd_avx2(local_2d00,_DAT_01faff00);
                              auVar124 = auVar92 & ~auVar146;
                              if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar124 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar124 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar124 >> 0x7f,0) == '\0')
                                    && (auVar124 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar124 >> 0xbf,0) == '\0')
                                  && (auVar124 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar124[0x1f]) {
                                auVar146 = auVar146 ^ auVar92;
                                auVar116 = ZEXT3264(local_2d80);
                              }
                              else {
                                p_Var9 = context->args->filter;
                                auVar116 = ZEXT3264(local_2d80);
                                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((unaff_R15->field_8).field_0x2 & 0x40) != 0)))) {
                                  local_2d60._0_8_ = pGVar77;
                                  local_2d20 = in_ZMM11._0_32_;
                                  auVar169 = ZEXT1664(auVar169._0_16_);
                                  auVar189 = ZEXT1664(auVar189._0_16_);
                                  auVar218 = ZEXT1664(auVar218._0_16_);
                                  auVar233 = ZEXT1664(auVar233._0_16_);
                                  auVar248 = ZEXT1664(auVar248._0_16_);
                                  auVar259 = ZEXT1664(auVar259._0_16_);
                                  in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                  in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                  in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                  (*p_Var9)((RTCFilterFunctionNArguments *)local_2ce0);
                                  auVar158._8_56_ = extraout_var_00;
                                  auVar158._0_8_ = extraout_XMM1_Qa_00;
                                  in_ZMM11 = ZEXT3264(local_2d20);
                                  auVar116 = ZEXT3264(local_2d80);
                                  auVar92 = vpcmpeqd_avx2(auVar158._0_32_,auVar158._0_32_);
                                  pGVar77 = (Geometry *)local_2d60._0_8_;
                                  uVar78 = local_2dd8;
                                  unaff_R15 = pGVar79;
                                }
                                auVar124 = vpcmpeqd_avx2(local_2d00,_DAT_01faff00);
                                auVar146 = auVar124 ^ auVar92;
                                auVar113._8_4_ = 0xff800000;
                                auVar113._0_8_ = 0xff800000ff800000;
                                auVar113._12_4_ = 0xff800000;
                                auVar113._16_4_ = 0xff800000;
                                auVar113._20_4_ = 0xff800000;
                                auVar113._24_4_ = 0xff800000;
                                auVar113._28_4_ = 0xff800000;
                                auVar124 = vblendvps_avx(auVar113,*(undefined1 (*) [32])
                                                                   (local_2ce0._24_8_ + 0x100),
                                                         auVar124);
                                *(undefined1 (*) [32])(local_2ce0._24_8_ + 0x100) = auVar124;
                              }
                              auVar124 = vblendvps_avx(in_ZMM11._0_32_,
                                                       *(undefined1 (*) [32])local_2d88,auVar146);
                              *(undefined1 (*) [32])local_2d88 = auVar124;
                            }
                            auVar133 = ZEXT3264(auVar146);
                            auVar124 = local_2c80 & ~auVar146;
                            auVar146 = vandnps_avx(auVar146,local_2c80);
                            auVar158 = ZEXT3264(auVar146);
                            bVar82 = (((((((auVar124 >> 0x1f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0 ||
                                          (auVar124 >> 0x3f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar124 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        SUB321(auVar124 >> 0x7f,0) != '\0') ||
                                       (auVar124 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar124 >> 0xbf,0) != '\0')
                                     || (auVar124 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || auVar124[0x1f] < '\0';
                            goto LAB_0054985c;
                          }
                        }
                        auVar116 = ZEXT3264(local_2d80);
                      }
LAB_0054985c:
                      auVar146 = auVar158._0_32_;
                      auVar150 = auVar116._0_32_;
                      if ((!bVar82) ||
                         (bVar82 = (Geometry *)0x2 < pGVar79,
                         pGVar79 = (Geometry *)((long)&(pGVar79->super_RefCount)._vptr_RefCount + 1)
                         , bVar82)) break;
                    }
                    auVar149 = vandps_avx(auVar146,auVar150);
                    auVar150 = auVar150 & auVar146;
                  } while (((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar150 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar150 >> 0x7f,0) != '\0')
                              || (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar150 >> 0xbf,0) != '\0') ||
                            (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar150[0x1f] < '\0') && (uVar74 = local_2bd8 + 1, uVar74 < local_2be0)
                          );
                  auVar146 = vpcmpeqd_avx2(auVar133._0_32_,auVar133._0_32_);
                  auVar114._0_4_ = auVar149._0_4_ ^ auVar146._0_4_;
                  auVar114._4_4_ = auVar149._4_4_ ^ auVar146._4_4_;
                  auVar114._8_4_ = auVar149._8_4_ ^ auVar146._8_4_;
                  auVar114._12_4_ = auVar149._12_4_ ^ auVar146._12_4_;
                  auVar114._16_4_ = auVar149._16_4_ ^ auVar146._16_4_;
                  auVar114._20_4_ = auVar149._20_4_ ^ auVar146._20_4_;
                  auVar114._24_4_ = auVar149._24_4_ ^ auVar146._24_4_;
                  auVar114._28_4_ = auVar149._28_4_ ^ auVar146._28_4_;
                }
                local_2bc0 = vorps_avx(local_2bc0,auVar114);
                auVar146 = auVar146 & ~local_2bc0;
                if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar146 >> 0x7f,0) == '\0') &&
                      (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar146 >> 0xbf,0) == '\0') &&
                    (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar146[0x1f]) goto LAB_0054a46d;
                auVar132._8_4_ = 0xff800000;
                auVar132._0_8_ = 0xff800000ff800000;
                auVar132._12_4_ = 0xff800000;
                auVar132._16_4_ = 0xff800000;
                auVar132._20_4_ = 0xff800000;
                auVar132._24_4_ = 0xff800000;
                auVar132._28_4_ = 0xff800000;
                auVar133 = ZEXT3264(auVar132);
                auVar146 = vblendvps_avx(local_2760,auVar132,local_2bc0);
                auVar124 = vpcmpeqd_avx2(local_2760,local_2760);
                auVar116 = ZEXT3264(auVar124);
                local_2760 = auVar146;
              }
              goto LAB_00548ab1;
            }
            uVar73 = root.ptr & 0xfffffffffffffff0;
            auVar146 = vcmpps_avx(local_2760,auVar158._0_32_,6);
            auVar103._8_4_ = 0x7f800000;
            auVar103._0_8_ = 0x7f8000007f800000;
            auVar103._12_4_ = 0x7f800000;
            auVar103._16_4_ = 0x7f800000;
            auVar103._20_4_ = 0x7f800000;
            auVar103._24_4_ = 0x7f800000;
            auVar103._28_4_ = 0x7f800000;
            do {
              uVar5 = *(ulong *)(uVar73 + 0x20 + lVar75 * 2);
              if (uVar5 == 8) {
                auVar158 = ZEXT3264(auVar103);
                break;
              }
              uVar81 = *(undefined4 *)(uVar73 + 0x90 + lVar75);
              auVar147._4_4_ = uVar81;
              auVar147._0_4_ = uVar81;
              auVar147._8_4_ = uVar81;
              auVar147._12_4_ = uVar81;
              auVar147._16_4_ = uVar81;
              auVar147._20_4_ = uVar81;
              auVar147._24_4_ = uVar81;
              auVar147._28_4_ = uVar81;
              uVar81 = *(undefined4 *)(uVar73 + 0x30 + lVar75);
              auVar163._4_4_ = uVar81;
              auVar163._0_4_ = uVar81;
              auVar163._8_4_ = uVar81;
              auVar163._12_4_ = uVar81;
              auVar163._16_4_ = uVar81;
              auVar163._20_4_ = uVar81;
              auVar163._24_4_ = uVar81;
              auVar163._28_4_ = uVar81;
              auVar124 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar81 = *(undefined4 *)(uVar73 + 0xb0 + lVar75);
              auVar178._4_4_ = uVar81;
              auVar178._0_4_ = uVar81;
              auVar178._8_4_ = uVar81;
              auVar178._12_4_ = uVar81;
              auVar178._16_4_ = uVar81;
              auVar178._20_4_ = uVar81;
              auVar178._24_4_ = uVar81;
              auVar178._28_4_ = uVar81;
              auVar122 = vfmadd231ps_fma(auVar163,auVar124,auVar147);
              uVar81 = *(undefined4 *)(uVar73 + 0x50 + lVar75);
              auVar148._4_4_ = uVar81;
              auVar148._0_4_ = uVar81;
              auVar148._8_4_ = uVar81;
              auVar148._12_4_ = uVar81;
              auVar148._16_4_ = uVar81;
              auVar148._20_4_ = uVar81;
              auVar148._24_4_ = uVar81;
              auVar148._28_4_ = uVar81;
              auVar85 = vfmadd231ps_fma(auVar148,auVar124,auVar178);
              uVar81 = *(undefined4 *)(uVar73 + 0xd0 + lVar75);
              auVar179._4_4_ = uVar81;
              auVar179._0_4_ = uVar81;
              auVar179._8_4_ = uVar81;
              auVar179._12_4_ = uVar81;
              auVar179._16_4_ = uVar81;
              auVar179._20_4_ = uVar81;
              auVar179._24_4_ = uVar81;
              auVar179._28_4_ = uVar81;
              uVar81 = *(undefined4 *)(uVar73 + 0x70 + lVar75);
              auVar212._4_4_ = uVar81;
              auVar212._0_4_ = uVar81;
              auVar212._8_4_ = uVar81;
              auVar212._12_4_ = uVar81;
              auVar212._16_4_ = uVar81;
              auVar212._20_4_ = uVar81;
              auVar212._24_4_ = uVar81;
              auVar212._28_4_ = uVar81;
              uVar81 = *(undefined4 *)(uVar73 + 0xa0 + lVar75);
              auVar226._4_4_ = uVar81;
              auVar226._0_4_ = uVar81;
              auVar226._8_4_ = uVar81;
              auVar226._12_4_ = uVar81;
              auVar226._16_4_ = uVar81;
              auVar226._20_4_ = uVar81;
              auVar226._24_4_ = uVar81;
              auVar226._28_4_ = uVar81;
              uVar81 = *(undefined4 *)(uVar73 + 0x40 + lVar75);
              auVar241._4_4_ = uVar81;
              auVar241._0_4_ = uVar81;
              auVar241._8_4_ = uVar81;
              auVar241._12_4_ = uVar81;
              auVar241._16_4_ = uVar81;
              auVar241._20_4_ = uVar81;
              auVar241._24_4_ = uVar81;
              auVar241._28_4_ = uVar81;
              auVar11 = vfmadd231ps_fma(auVar212,auVar124,auVar179);
              auVar12 = vfmadd231ps_fma(auVar241,auVar124,auVar226);
              uVar81 = *(undefined4 *)(uVar73 + 0xc0 + lVar75);
              auVar180._4_4_ = uVar81;
              auVar180._0_4_ = uVar81;
              auVar180._8_4_ = uVar81;
              auVar180._12_4_ = uVar81;
              auVar180._16_4_ = uVar81;
              auVar180._20_4_ = uVar81;
              auVar180._24_4_ = uVar81;
              auVar180._28_4_ = uVar81;
              uVar81 = *(undefined4 *)(uVar73 + 0x60 + lVar75);
              auVar227._4_4_ = uVar81;
              auVar227._0_4_ = uVar81;
              auVar227._8_4_ = uVar81;
              auVar227._12_4_ = uVar81;
              auVar227._16_4_ = uVar81;
              auVar227._20_4_ = uVar81;
              auVar227._24_4_ = uVar81;
              auVar227._28_4_ = uVar81;
              uVar81 = *(undefined4 *)(uVar73 + 0xe0 + lVar75);
              auVar256._4_4_ = uVar81;
              auVar256._0_4_ = uVar81;
              auVar256._8_4_ = uVar81;
              auVar256._12_4_ = uVar81;
              auVar256._16_4_ = uVar81;
              auVar256._20_4_ = uVar81;
              auVar256._24_4_ = uVar81;
              auVar256._28_4_ = uVar81;
              auVar123 = vfmadd231ps_fma(auVar227,auVar124,auVar180);
              uVar81 = *(undefined4 *)(uVar73 + 0x80 + lVar75);
              auVar181._4_4_ = uVar81;
              auVar181._0_4_ = uVar81;
              auVar181._8_4_ = uVar81;
              auVar181._12_4_ = uVar81;
              auVar181._16_4_ = uVar81;
              auVar181._20_4_ = uVar81;
              auVar181._24_4_ = uVar81;
              auVar181._28_4_ = uVar81;
              auVar161 = vfmadd231ps_fma(auVar181,auVar124,auVar256);
              auVar66._8_8_ = local_2900._8_8_;
              auVar66._0_8_ = local_2900._0_8_;
              auVar66._16_8_ = local_2900._16_8_;
              auVar66._24_8_ = local_2900._24_8_;
              auVar259 = ZEXT3264(auVar66);
              auVar67._8_8_ = local_2900._40_8_;
              auVar67._0_8_ = local_2900._32_8_;
              auVar67._16_8_ = local_2900._48_8_;
              auVar67._24_8_ = local_2900._56_8_;
              auVar68._8_8_ = local_2900._72_8_;
              auVar68._0_8_ = local_2900._64_8_;
              auVar68._16_8_ = local_2900._80_8_;
              auVar68._24_8_ = local_2900._88_8_;
              in_ZMM11 = ZEXT3264(auVar68);
              in_ZMM12 = ZEXT3264(local_2840);
              auVar110 = vsubps_avx(ZEXT1632(auVar122),auVar66);
              auVar13._4_4_ = local_2840._4_4_ * auVar110._4_4_;
              auVar13._0_4_ = local_2840._0_4_ * auVar110._0_4_;
              auVar13._8_4_ = local_2840._8_4_ * auVar110._8_4_;
              auVar13._12_4_ = local_2840._12_4_ * auVar110._12_4_;
              auVar13._16_4_ = local_2840._16_4_ * auVar110._16_4_;
              auVar13._20_4_ = local_2840._20_4_ * auVar110._20_4_;
              auVar13._24_4_ = local_2840._24_4_ * auVar110._24_4_;
              auVar13._28_4_ = auVar110._28_4_;
              auVar110 = vsubps_avx(ZEXT1632(auVar85),auVar67);
              in_ZMM13 = ZEXT3264(local_2820);
              auVar133._0_4_ = local_2820._0_4_ * auVar110._0_4_;
              auVar133._4_4_ = local_2820._4_4_ * auVar110._4_4_;
              auVar133._8_4_ = local_2820._8_4_ * auVar110._8_4_;
              auVar133._12_4_ = local_2820._12_4_ * auVar110._12_4_;
              auVar133._16_4_ = local_2820._16_4_ * auVar110._16_4_;
              auVar133._20_4_ = local_2820._20_4_ * auVar110._20_4_;
              auVar133._28_36_ = in_ZMM14._28_36_;
              auVar133._24_4_ = local_2820._24_4_ * auVar110._24_4_;
              auVar145 = auVar133._0_32_;
              in_ZMM14 = ZEXT3264(auVar145);
              auVar110 = vsubps_avx(ZEXT1632(auVar11),auVar68);
              auVar169._0_4_ = auVar110._0_4_ * (float)local_2800._0_4_;
              auVar169._4_4_ = auVar110._4_4_ * (float)local_2800._4_4_;
              auVar169._8_4_ = auVar110._8_4_ * fStack_27f8;
              auVar169._12_4_ = auVar110._12_4_ * fStack_27f4;
              auVar169._16_4_ = auVar110._16_4_ * fStack_27f0;
              auVar169._20_4_ = auVar110._20_4_ * fStack_27ec;
              auVar169._28_36_ = in_ZMM15._28_36_;
              auVar169._24_4_ = auVar110._24_4_ * fStack_27e8;
              auVar162 = auVar169._0_32_;
              in_ZMM15 = ZEXT3264(auVar162);
              auVar110 = vsubps_avx(ZEXT1632(auVar12),auVar66);
              auVar242._0_4_ = local_2840._0_4_ * auVar110._0_4_;
              auVar242._4_4_ = local_2840._4_4_ * auVar110._4_4_;
              auVar242._8_4_ = local_2840._8_4_ * auVar110._8_4_;
              auVar242._12_4_ = local_2840._12_4_ * auVar110._12_4_;
              auVar242._16_4_ = local_2840._16_4_ * auVar110._16_4_;
              auVar242._20_4_ = local_2840._20_4_ * auVar110._20_4_;
              auVar242._24_4_ = local_2840._24_4_ * auVar110._24_4_;
              auVar242._28_4_ = 0;
              auVar248 = ZEXT3264(auVar242);
              auVar110 = vsubps_avx(ZEXT1632(auVar123),auVar67);
              auVar228._0_4_ = local_2820._0_4_ * auVar110._0_4_;
              auVar228._4_4_ = local_2820._4_4_ * auVar110._4_4_;
              auVar228._8_4_ = local_2820._8_4_ * auVar110._8_4_;
              auVar228._12_4_ = local_2820._12_4_ * auVar110._12_4_;
              auVar228._16_4_ = local_2820._16_4_ * auVar110._16_4_;
              auVar228._20_4_ = local_2820._20_4_ * auVar110._20_4_;
              auVar228._24_4_ = local_2820._24_4_ * auVar110._24_4_;
              auVar228._28_4_ = 0;
              auVar233 = ZEXT3264(auVar228);
              auVar110 = vsubps_avx(ZEXT1632(auVar161),auVar68);
              auVar182._0_4_ = auVar110._0_4_ * (float)local_2800._0_4_;
              auVar182._4_4_ = auVar110._4_4_ * (float)local_2800._4_4_;
              auVar182._8_4_ = auVar110._8_4_ * fStack_27f8;
              auVar182._12_4_ = auVar110._12_4_ * fStack_27f4;
              auVar182._16_4_ = auVar110._16_4_ * fStack_27f0;
              auVar182._20_4_ = auVar110._20_4_ * fStack_27ec;
              auVar182._24_4_ = auVar110._24_4_ * fStack_27e8;
              auVar182._28_4_ = 0;
              auVar110 = vpminsd_avx2(auVar13,auVar242);
              auVar92 = vpminsd_avx2(auVar145,auVar228);
              auVar110 = vpmaxsd_avx2(auVar110,auVar92);
              auVar92 = vpminsd_avx2(auVar162,auVar182);
              auVar110 = vpmaxsd_avx2(auVar110,auVar92);
              auVar188._4_4_ = auVar110._4_4_ * 0.99999964;
              auVar188._0_4_ = auVar110._0_4_ * 0.99999964;
              auVar188._8_4_ = auVar110._8_4_ * 0.99999964;
              auVar188._12_4_ = auVar110._12_4_ * 0.99999964;
              auVar188._16_4_ = auVar110._16_4_ * 0.99999964;
              auVar188._20_4_ = auVar110._20_4_ * 0.99999964;
              auVar188._24_4_ = auVar110._24_4_ * 0.99999964;
              auVar188._28_4_ = auVar110._28_4_;
              auVar110 = vpmaxsd_avx2(auVar13,auVar242);
              auVar156 = vpmaxsd_avx2(auVar145,auVar228);
              auVar92 = vpminsd_avx2(auVar110,auVar156);
              auVar110 = vpmaxsd_avx2(auVar162,auVar182);
              auVar110 = vpminsd_avx2(auVar92,auVar110);
              auVar14._4_4_ = auVar110._4_4_ * 1.0000004;
              auVar14._0_4_ = auVar110._0_4_ * 1.0000004;
              auVar14._8_4_ = auVar110._8_4_ * 1.0000004;
              auVar14._12_4_ = auVar110._12_4_ * 1.0000004;
              auVar14._16_4_ = auVar110._16_4_ * 1.0000004;
              auVar14._20_4_ = auVar110._20_4_ * 1.0000004;
              auVar14._24_4_ = auVar110._24_4_ * 1.0000004;
              auVar14._28_4_ = auVar110._28_4_;
              auVar92 = vpmaxsd_avx2(auVar188,local_2780);
              auVar110 = vpminsd_avx2(auVar14,local_2760);
              auVar110 = vcmpps_avx(auVar92,auVar110,2);
              if (((uint)root.ptr & 7) == 6) {
                uVar81 = *(undefined4 *)(uVar73 + 0xf0 + lVar75);
                auVar183._4_4_ = uVar81;
                auVar183._0_4_ = uVar81;
                auVar183._8_4_ = uVar81;
                auVar183._12_4_ = uVar81;
                auVar183._16_4_ = uVar81;
                auVar183._20_4_ = uVar81;
                auVar183._24_4_ = uVar81;
                auVar183._28_4_ = uVar81;
                auVar92 = vcmpps_avx(auVar183,auVar124,2);
                uVar81 = *(undefined4 *)(uVar73 + 0x100 + lVar75);
                auVar156._4_4_ = uVar81;
                auVar156._0_4_ = uVar81;
                auVar156._8_4_ = uVar81;
                auVar156._12_4_ = uVar81;
                auVar156._16_4_ = uVar81;
                auVar156._20_4_ = uVar81;
                auVar156._24_4_ = uVar81;
                auVar156._28_4_ = uVar81;
                auVar124 = vcmpps_avx(auVar124,auVar156,1);
                auVar124 = vandps_avx(auVar92,auVar124);
                auVar124 = vandps_avx(auVar124,auVar110);
                auVar122 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
              }
              else {
                auVar122 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
              }
              auVar218 = ZEXT3264(auVar156);
              auVar189 = ZEXT3264(auVar92);
              auVar85 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
              auVar169 = ZEXT1664(auVar85);
              auVar122 = vpand_avx(auVar122,auVar85);
              auVar124 = vpmovzxwd_avx2(auVar122);
              auVar124 = vpslld_avx2(auVar124,0x1f);
              auVar133 = ZEXT3264(auVar124);
              if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar124 >> 0x7f,0) == '\0') &&
                    (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar124 >> 0xbf,0) == '\0') &&
                  (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar124[0x1f]) {
                auVar158 = ZEXT3264(auVar103);
                uVar5 = uVar74;
              }
              else {
                auVar164._8_4_ = 0x7f800000;
                auVar164._0_8_ = 0x7f8000007f800000;
                auVar164._12_4_ = 0x7f800000;
                auVar164._16_4_ = 0x7f800000;
                auVar164._20_4_ = 0x7f800000;
                auVar164._24_4_ = 0x7f800000;
                auVar164._28_4_ = 0x7f800000;
                auVar169 = ZEXT3264(auVar164);
                auVar124 = vblendvps_avx(auVar164,auVar188,auVar124);
                auVar158 = ZEXT3264(auVar124);
                if (uVar74 != 8) {
                  *puVar80 = uVar74;
                  puVar80 = puVar80 + 1;
                  *pauVar76 = auVar103;
                  pauVar76 = pauVar76 + 1;
                }
              }
              uVar74 = uVar5;
              auVar103 = auVar158._0_32_;
              lVar75 = lVar75 + 4;
            } while (lVar75 != 0);
            if (uVar74 == 8) {
              iVar71 = 4;
              auVar146 = vpcmpeqd_avx2(auVar103,auVar103);
              auVar116 = ZEXT3264(auVar146);
              goto LAB_0054a33e;
            }
            auVar146 = vcmpps_avx(local_2760,auVar158._0_32_,6);
            uVar81 = vmovmskps_avx(auVar146);
            auVar146 = vpcmpeqd_avx2(auVar103,auVar103);
            auVar116 = ZEXT3264(auVar146);
            root.ptr = uVar74;
          } while ((byte)uVar78 < (byte)POPCOUNT(uVar81));
          *puVar80 = uVar74;
          puVar80 = puVar80 + 1;
          *pauVar76 = auVar158._0_32_;
          pauVar76 = pauVar76 + 1;
          iVar71 = 4;
        }
        else {
          local_2dc0 = (undefined1  [8])CONCAT44(0,POPCOUNT(uVar81));
          while (unaff_R15 != (Geometry *)0x0) {
            k = 0;
            for (pGVar77 = unaff_R15; ((ulong)pGVar77 & 1) == 0;
                pGVar77 = (Geometry *)((ulong)pGVar77 >> 1 | 0x8000000000000000)) {
              k = k + 1;
            }
            local_2c80._0_8_ = k;
            auVar146 = ZEXT1632(auVar116._0_16_);
            auVar133 = ZEXT1664(auVar133._0_16_);
            auVar169 = ZEXT1664(auVar169._0_16_);
            auVar189 = ZEXT1664(auVar189._0_16_);
            auVar218 = ZEXT1664(auVar218._0_16_);
            auVar233 = ZEXT1664(auVar233._0_16_);
            auVar248 = ZEXT1664(auVar248._0_16_);
            auVar259 = ZEXT1664(auVar259._0_16_);
            in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            bVar82 = occluded1(local_2be8,local_2bf0,root,k,&local_2dd9,ray,
                               (TravRayK<8,_true> *)&local_2900.field_0,context);
            if (bVar82) {
              *(undefined4 *)(local_2bc0 + local_2c80._0_8_ * 4) = 0xffffffff;
            }
            unaff_R15 = (Geometry *)((ulong)&unaff_R15[-1].field_0x5f & (ulong)unaff_R15);
            auVar146 = vpcmpeqd_avx2(auVar146,auVar146);
            auVar116 = ZEXT3264(auVar146);
            auVar158 = ZEXT3264(local_2d20);
            uVar78 = local_2dd8;
          }
          auVar146 = auVar116._0_32_ & ~local_2bc0;
          iVar71 = 3;
          if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar146 >> 0x7f,0) != '\0') ||
                (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar146 >> 0xbf,0) != '\0') ||
              (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar146[0x1f] < '\0') {
            auVar91._8_4_ = 0xff800000;
            auVar91._0_8_ = 0xff800000ff800000;
            auVar91._12_4_ = 0xff800000;
            auVar91._16_4_ = 0xff800000;
            auVar91._20_4_ = 0xff800000;
            auVar91._24_4_ = 0xff800000;
            auVar91._28_4_ = 0xff800000;
            auVar133 = ZEXT3264(auVar91);
            auVar146 = vblendvps_avx(local_2760,auVar91,local_2bc0);
            auVar124 = vpcmpeqd_avx2(local_2760,local_2760);
            auVar116 = ZEXT3264(auVar124);
            local_2760 = auVar146;
            iVar71 = 2;
          }
          unaff_R15 = (Geometry *)0x0;
          if ((uint)uVar78 < (uint)local_2dc0._0_4_) goto LAB_00548aef;
        }
LAB_0054a33e:
      } while (iVar71 != 3);
LAB_0054a46d:
      auVar146 = vandps_avx(local_2740,local_2bc0);
      auVar115._8_4_ = 0xff800000;
      auVar115._0_8_ = 0xff800000ff800000;
      auVar115._12_4_ = 0xff800000;
      auVar115._16_4_ = 0xff800000;
      auVar115._20_4_ = 0xff800000;
      auVar115._24_4_ = 0xff800000;
      auVar115._28_4_ = 0xff800000;
      auVar146 = vmaskmovps_avx(auVar146,auVar115);
      *(undefined1 (*) [32])local_2d88 = auVar146;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }